

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_NewScObject_Impl<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>>,true,false>
          (InterpreterStackFrame *this,
          OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout,
          InlineCacheIndex inlineCacheIndex,AuxArray<unsigned_int> *spreadIndices)

{
  Var pvVar1;
  
  pvVar1 = GetReg<unsigned_int>(this,playout->Function);
  pvVar1 = ProfiledNewScObject_Helper
                     (this,pvVar1,playout->ArgCount,playout[1].ArgCount,inlineCacheIndex,
                      spreadIndices);
  SetReg<unsigned_int>(this,playout->Return,pvVar1);
  return;
}

Assistant:

void InterpreterStackFrame::OP_NewScObject_Impl(const unaligned T* playout, InlineCacheIndex inlineCacheIndex, const Js::AuxArray<uint32> *spreadIndices)
    {
        if (ICIndex)
        {
            Assert(inlineCacheIndex != Js::Constants::NoInlineCacheIndex);
        }
        Var newVarInstance =
#if ENABLE_PROFILE_INFO
            Profiled ?
            ProfiledNewScObject_Helper(
                GetReg(playout->Function),
                playout->ArgCount,
                static_cast<const unaligned OpLayoutDynamicProfile<T> *>(playout)->profileId,
                inlineCacheIndex,
                spreadIndices) :
#endif
            NewScObject_Helper(GetReg(playout->Function), playout->ArgCount, spreadIndices);
        SetReg((RegSlot)playout->Return, newVarInstance);
    }

    template <class T, bool Profiled>
    void InterpreterStackFrame::OP_ProfiledNewScObjArray_Impl(const unaligned T* playout, const Js::AuxArray<uint32> *spreadIndices)
    {
        // Always profile this operation when auto-profiling so that array type changes are tracked
#if ENABLE_PROFILE_INFO
        if (!Profiled && !isAutoProfiling)
#else
        Assert(!Profiled);
#endif
        {
            OP_NewScObjArray_Impl<T, Profiled>(playout, spreadIndices);
            return;
        }

#if ENABLE_PROFILE_INFO
        Arguments args(CallInfo(CallFlags_New, playout->ArgCount), m_outParams);

        uint32 spreadSize = 0;
        if (spreadIndices != nullptr)
        {
            spreadSize = JavascriptFunction::GetSpreadSize(args, spreadIndices, scriptContext);

            // Allocate room on the stack for the spread args.
            Arguments outArgs(CallInfo(CallFlags_New, 0), nullptr);
            outArgs.Info.Count = spreadSize;
            const unsigned STACK_ARGS_ALLOCA_THRESHOLD = 8; // Number of stack args we allow before using _alloca
            Var stackArgs[STACK_ARGS_ALLOCA_THRESHOLD];
            size_t outArgsSize = 0;
            if (outArgs.Info.Count > STACK_ARGS_ALLOCA_THRESHOLD)
            {
                PROBE_STACK(scriptContext, outArgs.Info.Count * sizeof(Var) + Js::Constants::MinStackDefault); // args + function call
                outArgsSize = outArgs.Info.Count * sizeof(Var);
                outArgs.Values = (Var*)_alloca(outArgsSize);
                ZeroMemory(outArgs.Values, outArgsSize);
            }
            else
            {
                outArgs.Values = stackArgs;
                outArgsSize = STACK_ARGS_ALLOCA_THRESHOLD * sizeof(Var);
                ZeroMemory(outArgs.Values, outArgsSize); // We may not use all of the elements
            }
            JavascriptFunction::SpreadArgs(args, outArgs, spreadIndices, scriptContext);

            SetReg(
                (RegSlot)playout->Return,
                ProfilingHelpers::ProfiledNewScObjArray(
                    GetReg(playout->Function),
                    outArgs,
                    function,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId2));
        }
        else
        {
            SetReg(
                (RegSlot)playout->Return,
                ProfilingHelpers::ProfiledNewScObjArray(
                    GetReg(playout->Function),
                    args,
                    function,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId2));
        }
        PopOut(playout->ArgCount);
#endif
    }

    void InterpreterStackFrame::OP_NewScObject_A_Impl(const unaligned OpLayoutAuxiliary * playout, RegSlot *target)
    {
        const Js::VarArrayVarCount * vars = Js::ByteCodeReader::ReadVarArrayVarCount(playout->Offset, this->GetFunctionBody());

        int count = Js::TaggedInt::ToInt32(vars->count);

        // Push the parameters to stack
        for (int i = 0; i < count; i++)
        {
            SetOut((ArgSlot)(i + 1), vars->elements[i]);
        }

        Var newVarInstance = NewScObject_Helper(GetReg((RegSlot)playout->C1), (ArgSlot)count + 1);
        SetReg((RegSlot)playout->R0, newVarInstance);

    }

    Var InterpreterStackFrame::NewScObject_Helper(Var target, ArgSlot ArgCount, const Js::AuxArray<uint32> *spreadIndices)
    {
        Arguments args(CallInfo(CallFlags_New, ArgCount), m_outParams);

        Var newVarInstance = nullptr;
        BEGIN_SAFE_REENTRANT_CALL(this->scriptContext->GetThreadContext())
        {
            newVarInstance = JavascriptOperators::NewScObject(target, args, GetScriptContext(), spreadIndices);
        }
        END_SAFE_REENTRANT_CALL

            PopOut(ArgCount);
        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(newVarInstance));
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
        {
            newVarInstance = JavascriptProxy::AutoProxyWrapper(newVarInstance);
            // this might come from a different scriptcontext.
            newVarInstance = CrossSite::MarshalVar(GetScriptContext(), newVarInstance);
        }
#endif
#ifdef ENABLE_BASIC_TELEMETRY
        {
            this->scriptContext->GetTelemetry().GetOpcodeTelemetry().NewScriptObject(target, args, newVarInstance);
        }
#endif
        return newVarInstance;
    }

#if ENABLE_PROFILE_INFO
    Var InterpreterStackFrame::ProfiledNewScObject_Helper(Var target, ArgSlot ArgCount, ProfileId profileId, InlineCacheIndex inlineCacheIndex, const Js::AuxArray<uint32> *spreadIndices)
    {
        Arguments args(CallInfo(CallFlags_New, ArgCount), m_outParams);

        Var newVarInstance = nullptr;
        BEGIN_SAFE_REENTRANT_CALL(this->scriptContext->GetThreadContext())
        {
            newVarInstance = ProfilingHelpers::ProfiledNewScObject(
                target,
                args,
                GetFunctionBody(),
                profileId,
                inlineCacheIndex,
                spreadIndices);
        }
        END_SAFE_REENTRANT_CALL

        PopOut(ArgCount);
        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(newVarInstance));
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
        {
            newVarInstance = JavascriptProxy::AutoProxyWrapper(newVarInstance);
            // this might come from a different scriptcontext.
            newVarInstance = CrossSite::MarshalVar(GetScriptContext(), newVarInstance);
        }
#endif
#ifdef TELEMETRY_PROFILED
        {
            this->scriptContext->GetTelemetry().GetOpcodeTelemetry().NewScriptObject(target, args, newVarInstance);
        }
#endif
        return newVarInstance;
    }
#endif

    template <typename T>
    void InterpreterStackFrame::OP_LdElementUndefined(const unaligned OpLayoutT_ElementU<T>* playout)
    {
        if (this->m_functionBody->IsEval())
        {
            JavascriptOperators::OP_LoadUndefinedToElementDynamic(GetReg(playout->Instance),
                this->m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex), GetScriptContext());
        }
        else
        {
            JavascriptOperators::OP_LoadUndefinedToElement(GetReg(playout->Instance),
                this->m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex));
        }
    }

    template <typename T>
    void InterpreterStackFrame::OP_LdLocalElementUndefined(const unaligned OpLayoutT_ElementRootU<T>* playout)
    {
        if (this->m_functionBody->IsEval())
        {
            JavascriptOperators::OP_LoadUndefinedToElementDynamic(this->localClosure,
                this->m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex), GetScriptContext());
        }
        else
        {
            JavascriptOperators::OP_LoadUndefinedToElement(this->localClosure,
                this->m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex));
        }
    }

    template <typename T>
    void InterpreterStackFrame::OP_LdElementUndefinedScoped(const unaligned OpLayoutT_ElementScopedU<T>* playout)
    {
        // Implicit root object as default instance
        JavascriptOperators::OP_LoadUndefinedToElementScoped(GetEnvForEvalCode(),
            this->m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex), GetReg(Js::FunctionBody::RootObjectRegSlot), GetScriptContext());
    }

    void InterpreterStackFrame::OP_ChkUndecl(Var aValue)
    {
        if (this->scriptContext->IsUndeclBlockVar(aValue))
        {
            JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
        }
    }

    void InterpreterStackFrame::OP_ChkNewCallFlag()
    {
        if (!(this->m_callFlags & CallFlags_New) && !this->TestFlags(InterpreterStackFrameFlags_FromBailOutInInlinee))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ClassConstructorCannotBeCalledWithoutNew);
        }
    }

    void InterpreterStackFrame::OP_EnsureNoRootProperty(uint propertyIdIndex)
    {
        Var instance = this->GetRootObject();
        JavascriptOperators::OP_EnsureNoRootProperty(instance, this->m_functionBody->GetReferencedPropertyId(propertyIdIndex));
    }

    void InterpreterStackFrame::OP_EnsureNoRootRedeclProperty(uint propertyIdIndex)
    {
        Var instance = this->GetRootObject();
        JavascriptOperators::OP_EnsureNoRootRedeclProperty(instance, this->m_functionBody->GetReferencedPropertyId(propertyIdIndex));
    }

    void InterpreterStackFrame::OP_EnsureCanDeclGloFunc(uint propertyIdIndex)
    {
        Var instance = this->GetRootObject();
        JavascriptOperators::OP_EnsureCanDeclGloFunc(instance, this->m_functionBody->GetReferencedPropertyId(propertyIdIndex));
    }

    void InterpreterStackFrame::OP_ScopedEnsureNoRedeclProperty(Var aValue, uint propertyIdIndex, Var aValue2)
    {
        Js::PropertyId propertyId = this->m_functionBody->GetReferencedPropertyId(propertyIdIndex);
        JavascriptOperators::OP_ScopedEnsureNoRedeclProperty((FrameDisplay*)aValue, propertyId, aValue2);
    }

    Var InterpreterStackFrame::OP_InitUndecl()
    {
        return this->scriptContext->GetLibrary()->GetUndeclBlockVar();
    }

    void InterpreterStackFrame::OP_InitUndeclSlot(Var aValue, int32 slot)
    {
        this->OP_StSlot(aValue, slot, this->scriptContext->GetLibrary()->GetUndeclBlockVar());
    }

    void InterpreterStackFrame::OP_TryCatch(const unaligned OpLayoutBr* playout)
    {
        Js::JavascriptExceptionObject* exception = NULL;
        try
        {
            this->nestedTryDepth++;
            // mark the stackFrame as 'in try block'
            this->OrFlags(InterpreterStackFrameFlags_WithinTryBlock);

            Js::JavascriptExceptionOperators::AutoCatchHandlerExists autoCatchHandlerExists(scriptContext);
            void * addrOfReturnAddr = _AddressOfReturnAddress();
            Js::JavascriptExceptionOperators::TryHandlerAddrOfReturnAddrStack tryHandlerAddrOfReturnAddrStack(scriptContext, addrOfReturnAddr);

#ifdef ENABLE_SCRIPT_DEBUGGING
            if (this->IsInDebugMode())
            {
#if ENABLE_TTD
                if (SHOULD_DO_TTD_STACK_STMT_OP(this->scriptContext))
                {
                    this->ProcessWithDebugging_PreviousStmtTracking();
                }
                else
                {
                    this->ProcessWithDebugging();
                }
#else
                this->ProcessWithDebugging();
#endif

                this->TrySetRetOffset();
            }
            else
#endif
            {
                this->Process();
                this->TrySetRetOffset();
            }
        }
        catch (const Js::JavascriptException& err)
        {
            // We are using C++ exception handling which does not unwind the stack in the catch block.
            // For stack overflow and OOM exceptions, we cannot run user code here because the stack is not unwind.
            exception = err.GetAndClear();
        }

        if (--this->nestedTryDepth == -1)
        {
            // unmark the stackFrame as 'in try block'
            this->ClearFlags(InterpreterStackFrameFlags_WithinTryBlock);
        }

        // Now that the stack is unwound, let's run the catch block.
        if (exception)
        {
            exception = exception->CloneIfStaticExceptionObject(scriptContext);
            // We've got a JS exception. Grab the exception object and assign it to the
            // catch object's location, then call the handler (i.e., we consume the Catch op here).
            Var catchObject = exception->GetThrownObject(scriptContext);

            m_reader.SetCurrentRelativeOffset((const byte *)(playout + 1), playout->RelativeJumpOffset);

            LayoutSize layoutSize;
            OpCode catchOp = m_reader.ReadOp(layoutSize);
#ifdef BYTECODE_BRANCH_ISLAND
            if (catchOp == Js::OpCode::BrLong)
            {
                Assert(layoutSize == SmallLayout);
                auto playoutBrLong = m_reader.BrLong();
                m_reader.SetCurrentRelativeOffset((const byte *)(playoutBrLong + 1), playoutBrLong->RelativeJumpOffset);
                catchOp = m_reader.ReadOp(layoutSize);
            }
#endif
            AssertMsg(catchOp == OpCode::Catch, "Catch op not found at catch offset");
            RegSlot reg = layoutSize == SmallLayout ? m_reader.Reg1_Small()->R0 :
                layoutSize == MediumLayout ? m_reader.Reg1_Medium()->R0 : m_reader.Reg1_Large()->R0;
            SetReg(reg, catchObject);

            ResetOut();

            this->nestedCatchDepth++;
            // mark the stackFrame as 'in catch block'
            this->OrFlags(InterpreterStackFrameFlags_WithinCatchBlock);

            this->ProcessCatch();

            if (--this->nestedCatchDepth == -1)
            {
                // unmark the stackFrame as 'in catch block'
                this->ClearFlags(InterpreterStackFrameFlags_WithinCatchBlock);
            }
        }
    }

    void InterpreterStackFrame::ProcessCatch()
    {
#if ENABLE_TTD
        //Clear any previous Exception Info
        if (SHOULD_DO_TTD_STACK_STMT_OP(this->scriptContext))
        {
            this->scriptContext->GetThreadContext()->TTDExecutionInfo->ProcessCatchInfoForLastExecutedStatements();
        }
#endif
#ifdef ENABLE_SCRIPT_DEBUGGING
        if (this->IsInDebugMode())
        {
            this->DebugProcess();
        }
        else
#endif
        {
            this->Process();
        }
    }

    int InterpreterStackFrame::ProcessFinally()
    {
        this->nestedFinallyDepth++;

        int newOffset = 0;
#ifdef ENABLE_SCRIPT_DEBUGGING
        if (this->IsInDebugMode())
        {
            newOffset = ::Math::PointerCastToIntegral<int>(this->DebugProcess());
        }
        else
#endif
        {
            newOffset = ::Math::PointerCastToIntegral<int>(this->Process());
        }

        return newOffset;
    }

    void InterpreterStackFrame::ProcessTryHandlerBailout(EHBailoutData * ehBailoutData, uint32 tryNestingDepth)
    {
        int catchOffset = ehBailoutData->catchOffset;
        int finallyOffset = ehBailoutData->finallyOffset;
        Js::JavascriptExceptionObject* exception = NULL;

        if (catchOffset != 0 || finallyOffset != 0)
        {
            try
            {
                this->nestedTryDepth++;
                // mark the stackFrame as 'in try block'
                this->OrFlags(InterpreterStackFrameFlags_WithinTryBlock);

                if (finallyOffset != 0)
                {
                    this->OrFlags(InterpreterStackFrameFlags_WithinTryFinallyBlock);
                }

                if (tryNestingDepth != 0)
                {
                    this->ProcessTryHandlerBailout(ehBailoutData->child, --tryNestingDepth);
                }

                if (catchOffset != 0)
                {
                    Js::JavascriptExceptionOperators::AutoCatchHandlerExists autoCatchHandlerExists(scriptContext);
                }

#ifdef ENABLE_SCRIPT_DEBUGGING
                if (this->IsInDebugMode())
                {
#if ENABLE_TTD
                    if (SHOULD_DO_TTD_STACK_STMT_OP(this->scriptContext))
                    {
                        this->ProcessWithDebugging_PreviousStmtTracking();
                    }
                    else
                    {
                        this->ProcessWithDebugging();
                    }
#else
                    this->ProcessWithDebugging();
#endif

                    this->TrySetRetOffset();
                }
                else
#endif
                {
                    this->Process();
                    this->TrySetRetOffset();
                }
            }
            catch (const Js::JavascriptException& err)
            {
                // We are using C++ exception handling which does not unwind the stack in the catch block.
                // For stack overflow and OOM exceptions, we cannot run user code here because the stack is not unwind.
                exception = err.GetAndClear();
            }
        }
        else if (ehBailoutData->ht == HandlerType::HT_Catch)
        {
            this->nestedCatchDepth++;
            // mark the stackFrame as 'in catch block'
            this->OrFlags(InterpreterStackFrameFlags_WithinCatchBlock);

            if (tryNestingDepth != 0)
            {
                this->ProcessTryHandlerBailout(ehBailoutData->child, --tryNestingDepth);
            }
            this->ProcessCatch();

            if (--this->nestedCatchDepth == -1)
            {
                // unmark the stackFrame as 'in catch block'
                this->ClearFlags(InterpreterStackFrameFlags_WithinCatchBlock);
            }
            return;
        }
        else
        {
            Assert(ehBailoutData->ht == HandlerType::HT_Finally);
            this->nestedFinallyDepth++;
            // mark the stackFrame as 'in finally block'
            this->OrFlags(InterpreterStackFrameFlags_WithinFinallyBlock);

            if (tryNestingDepth != 0)
            {
                this->ProcessTryHandlerBailout(ehBailoutData->child, --tryNestingDepth);
            }

            Js::JavascriptExceptionObject * exceptionObj = this->scriptContext->GetThreadContext()->GetPendingFinallyException();
            this->scriptContext->GetThreadContext()->SetPendingFinallyException(nullptr);

            int finallyEndOffset = this->ProcessFinally();

            if (--this->nestedFinallyDepth == -1)
            {
                // unmark the stackFrame as 'in finally block'
                this->ClearFlags(InterpreterStackFrameFlags_WithinFinallyBlock);
            }

            // Finally exited with LeaveNull, We don't throw for early returns
            if (finallyEndOffset == 0 && exceptionObj)
            {
#if ENABLE_NATIVE_CODEGEN
                if (scriptContext->GetThreadContext()->GetTryHandlerAddrOfReturnAddr() != nullptr)
                {
                    JavascriptExceptionOperators::WalkStackForCleaningUpInlineeInfo(scriptContext, nullptr, scriptContext->GetThreadContext()->GetTryHandlerAddrOfReturnAddr());
                }
#endif
                JavascriptExceptionOperators::DoThrow(const_cast<Js::JavascriptExceptionObject *>(exceptionObj), scriptContext);
            }
            if (finallyEndOffset != 0)
            {
                m_reader.SetCurrentOffset(finallyEndOffset);
            }

            return;
        }

        if (--this->nestedTryDepth == -1)
        {
            // unmark the stackFrame as 'in try block'
            this->ClearFlags(InterpreterStackFrameFlags_WithinTryBlock | InterpreterStackFrameFlags_WithinTryFinallyBlock);
        }

        // Now that the stack is unwound, let's run the catch block.
        if (exception)
        {
            if (catchOffset != 0)
            {
                exception = exception->CloneIfStaticExceptionObject(scriptContext);
                // We've got a JS exception. Grab the exception object and assign it to the
                // catch object's location, then call the handler (i.e., we consume the Catch op here).
                Var catchObject = exception->GetThrownObject(scriptContext);

                m_reader.SetCurrentOffset(catchOffset);

                LayoutSize layoutSize;
                OpCode catchOp = m_reader.ReadOp(layoutSize);
#ifdef BYTECODE_BRANCH_ISLAND
                if (catchOp == Js::OpCode::BrLong)
                {
                    Assert(layoutSize == SmallLayout);
                    auto playoutBrLong = m_reader.BrLong();
                    m_reader.SetCurrentRelativeOffset((const byte *)(playoutBrLong + 1), playoutBrLong->RelativeJumpOffset);
                    catchOp = m_reader.ReadOp(layoutSize);
                }
#endif
                AssertMsg(catchOp == OpCode::Catch, "Catch op not found at catch offset");
                RegSlot reg = layoutSize == SmallLayout ? m_reader.Reg1_Small()->R0 :
                    layoutSize == MediumLayout ? m_reader.Reg1_Medium()->R0 : m_reader.Reg1_Large()->R0;
                SetReg(reg, catchObject);

                ResetOut();

                this->nestedCatchDepth++;
                // mark the stackFrame as 'in catch block'
                this->OrFlags(InterpreterStackFrameFlags_WithinCatchBlock);

                this->ProcessCatch();

                if (--this->nestedCatchDepth == -1)
                {
                    // unmark the stackFrame as 'in catch block'
                    this->ClearFlags(InterpreterStackFrameFlags_WithinCatchBlock);
                }
            }
            else
            {
                Assert(finallyOffset != 0);
                exception = exception->CloneIfStaticExceptionObject(scriptContext);

                m_reader.SetCurrentOffset(finallyOffset);

                ResetOut();

                this->nestedFinallyDepth++;
                // mark the stackFrame as 'in finally block'
                this->OrFlags(InterpreterStackFrameFlags_WithinFinallyBlock);

                LayoutSize layoutSize;
                OpCode finallyOp = m_reader.ReadOp(layoutSize);
#ifdef BYTECODE_BRANCH_ISLAND
                if (finallyOp == Js::OpCode::BrLong)
                {
                    Assert(layoutSize == SmallLayout);
                    auto playoutBrLong = m_reader.BrLong();
                    m_reader.SetCurrentRelativeOffset((const byte *)(playoutBrLong + 1), playoutBrLong->RelativeJumpOffset);
                    finallyOp = m_reader.ReadOp(layoutSize);
                }
#endif
                Assert(finallyOp == Js::OpCode::Finally);

                int finallyEndOffset = this->ProcessFinally();

                if (--this->nestedFinallyDepth == -1)
                {
                    // unmark the stackFrame as 'in finally block'
                    this->ClearFlags(InterpreterStackFrameFlags_WithinFinallyBlock);
                }
                if (finallyEndOffset == 0)
                {
                    JavascriptExceptionOperators::DoThrow(exception, scriptContext);
                }
                m_reader.SetCurrentOffset(finallyEndOffset);
            }
        }
        else
        {
            if (finallyOffset != 0)
            {
                int currOffset = m_reader.GetCurrentOffset();

                m_reader.SetCurrentOffset(finallyOffset);

                this->nestedFinallyDepth++;

                // mark the stackFrame as 'in finally block'
                this->OrFlags(InterpreterStackFrameFlags_WithinFinallyBlock);

                LayoutSize layoutSize;
                OpCode finallyOp = m_reader.ReadOp(layoutSize);
#ifdef BYTECODE_BRANCH_ISLAND
                if (finallyOp == Js::OpCode::BrLong)
                {
                    Assert(layoutSize == SmallLayout);
                    auto playoutBrLong = m_reader.BrLong();
                    m_reader.SetCurrentRelativeOffset((const byte *)(playoutBrLong + 1), playoutBrLong->RelativeJumpOffset);
                    finallyOp = m_reader.ReadOp(layoutSize);
                }
#endif
                Assert(finallyOp == Js::OpCode::Finally);

                int finallyEndOffset = this->ProcessFinally();

                if (--this->nestedFinallyDepth == -1)
                {
                    // unmark the stackFrame as 'in finally block'
                    this->ClearFlags(InterpreterStackFrameFlags_WithinFinallyBlock);
                }
                if (finallyEndOffset == 0)
                {
                    m_reader.SetCurrentOffset(currOffset);
                }
            }
        }
    }

    void InterpreterStackFrame::TrySetRetOffset()
    {
        Assert(this->TestFlags(Js::InterpreterStackFrameFlags_WithinTryBlock));
        // It may happen that a JITted loop body returned the offset of RET. If the loop body was
        // called from a try, the interpreter "Process()" should also just return.
        if (this->retOffset != 0)
        {
            m_reader.SetCurrentOffset(this->retOffset);
        }
    }

    bool InterpreterStackFrame::IsInCatchOrFinallyBlock()
    {
        return this->TestFlags(Js::InterpreterStackFrameFlags_WithinCatchBlock) ||
            this->TestFlags(Js::InterpreterStackFrameFlags_WithinFinallyBlock);
    }

    void InterpreterStackFrame::OP_BeginBodyScope()
    {
        // Currently we are using the closures created for the param scope.
        // This marks the beginning of the body scope, so let's create new closures for the body scope.
        FunctionBody *executeFunction = this->function->GetFunctionBody();
        Assert(!this->IsParamScopeDone() && !executeFunction->IsParamAndBodyScopeMerged());

        // Save the current closure. We have to use this while copying the initial value of body symbols
        // from the corresponding symbols in the param.
        this->SetParamClosure(this->GetLocalClosure());
        this->SetNonVarReg(executeFunction->GetParamClosureRegister(), nullptr);

        this->SetIsParamScopeDone(true);

        // Create a new local closure for the body when either body scope has scope slots allocated or
        // eval is present which can leak declarations.
        if (executeFunction->scopeSlotArraySize > 0 || executeFunction->HasScopeObject())
        {
            this->InitializeClosures();
        }
    }

    void InterpreterStackFrame::OP_ResumeCatch()
    {
        this->OrFlags(InterpreterStackFrameFlags_WithinCatchBlock);

#ifdef ENABLE_SCRIPT_DEBUGGING
        if (this->IsInDebugMode())
        {
            this->DebugProcess();
        }
        else
#endif
        {
            this->Process();
        }

        this->ClearFlags(InterpreterStackFrameFlags_WithinCatchBlock);
    }

    /// ---------------------------------------------------------------------------------------------------
    /// The behavior we want is the following:
    /// - If the control leaves the user's try without throwing, execute the finally and continue
    ///   after the end of the try.
    /// - If the user code throws, catch this exception and then execute this finally while unwinding to
    ///   the handler (if any).
    /// ---------------------------------------------------------------------------------------------------
    void InterpreterStackFrame::ProcessTryFinally(const byte* ip, Js::JumpOffset jumpOffset, Js::RegSlot regException, Js::RegSlot regOffset, bool hasYield)
    {
        Js::JavascriptExceptionObject* pExceptionObject = nullptr;
        bool skipFinallyBlock = false;

        try
        {
            Js::Var result = nullptr;

            this->nestedTryDepth++;
            // mark the stackFrame as 'in try block'
            this->OrFlags(InterpreterStackFrameFlags_WithinTryBlock | InterpreterStackFrameFlags_WithinTryFinallyBlock);

            if (shouldCacheSP)
            {
                CacheSp();
            }

#ifdef ENABLE_SCRIPT_DEBUGGING
            if (this->IsInDebugMode())
            {
#if ENABLE_TTD
                if (SHOULD_DO_TTD_STACK_STMT_OP(this->scriptContext))
                {
                    result = this->ProcessWithDebugging_PreviousStmtTracking();
                }
                else
                {
                    result = this->ProcessWithDebugging();
                }
#else
                result = this->ProcessWithDebugging();
#endif
            }
            else
#endif
            {
                result = this->Process();
            }

            if (result == nullptr)
            {
                Assert(hasYield);
                skipFinallyBlock = true;
            }
        }
        catch (const Js::JavascriptException& err)
        {
            pExceptionObject = err.GetAndClear();
        }

        if (--this->nestedTryDepth == -1)
        {
            // unmark the stackFrame as 'in try block'
            this->ClearFlags(InterpreterStackFrameFlags_WithinTryBlock | InterpreterStackFrameFlags_WithinTryFinallyBlock);
        }

        shouldCacheSP = !skipFinallyBlock;

        if (skipFinallyBlock)
        {
            // A leave occurred due to a yield
            return;
        }

        // Save the current IP so execution can continue there if the finally doesn't
        // take control of the flow.
        int newOffset = 0;
        int currOffset = m_reader.GetCurrentOffset();
        if (hasYield)
        {
            // save the exception if there is one to a register in case we yield during the finally block
            // and need to get that exception object back upon resume in OP_ResumeFinally
            SetNonVarReg(regException, pExceptionObject);
            SetNonVarReg(regOffset, reinterpret_cast<Js::Var>(currOffset));
        }

        if (pExceptionObject)
        {
            // Clone static exception object early in case finally block overwrites it
            pExceptionObject = pExceptionObject->CloneIfStaticExceptionObject(scriptContext);
        }

#ifdef ENABLE_SCRIPT_DEBUGGING
        if (pExceptionObject && this->IsInDebugMode() &&
            pExceptionObject != scriptContext->GetThreadContext()->GetPendingSOErrorObject())
        {
            // Swallowing an exception that has triggered a finally is not implemented
            // (This appears to be the same behavior as ie8)
            pExceptionObject->SetDebuggerSkip(false);
        }
#endif

        // Call into the finally by setting the IP, consuming the Finally, and letting the interpreter recurse.
        m_reader.SetCurrentRelativeOffset(ip, jumpOffset);

        RestoreSp();
        // mark the stackFrame as 'in finally block'
        this->OrFlags(InterpreterStackFrameFlags_WithinFinallyBlock);

        LayoutSize layoutSize;
        OpCode finallyOp = m_reader.ReadOp(layoutSize);
#ifdef BYTECODE_BRANCH_ISLAND
        if (finallyOp == Js::OpCode::BrLong)
        {
            Assert(layoutSize == SmallLayout);
            auto playoutBrLong = m_reader.BrLong();
            m_reader.SetCurrentRelativeOffset((const byte *)(playoutBrLong + 1), playoutBrLong->RelativeJumpOffset);
            finallyOp = m_reader.ReadOp(layoutSize);
        }
#endif
        AssertMsg(finallyOp == OpCode::Finally, "Finally op not found at catch offset");

        newOffset = this->ProcessFinally();

        if (--this->nestedFinallyDepth == -1)
        {
            // unmark the stackFrame as 'in finally block'
            this->ClearFlags(InterpreterStackFrameFlags_WithinFinallyBlock);
        }

        bool endOfFinallyBlock = newOffset == 0;
        if (endOfFinallyBlock)
        {
            // Finally completed without taking over the flow. Resume where we left off before calling it.
            m_reader.SetCurrentOffset(currOffset);
        }
        else
        {
            // Finally seized the flow with a jump out of its scope. Resume at the jump target and
            // force the runtime to return to this frame without executing the catch.
            m_reader.SetCurrentOffset(newOffset);
            return;
        }

        if (pExceptionObject)
        {
            JavascriptExceptionOperators::DoThrow(pExceptionObject, scriptContext);
        }
    }

    void InterpreterStackFrame::OP_TryFinally(const unaligned OpLayoutBr* playout)
    {
        ProcessTryFinally((const byte*)(playout + 1), playout->RelativeJumpOffset);
    }

    void InterpreterStackFrame::OP_TryFinallyWithYield(const byte* ip, Js::JumpOffset jumpOffset, Js::RegSlot regException, Js::RegSlot regOffset)
    {
        ProcessTryFinally(ip, jumpOffset, regException, regOffset, true);
    }

    void InterpreterStackFrame::OP_ResumeFinally(const byte* ip, Js::JumpOffset jumpOffset, RegSlot exceptionRegSlot, RegSlot offsetRegSlot)
    {
        this->OrFlags(InterpreterStackFrameFlags_WithinFinallyBlock);

        int newOffset = 0;
#ifdef ENABLE_SCRIPT_DEBUGGING
        if (this->IsInDebugMode())
        {
            newOffset = ::Math::PointerCastToIntegral<int>(this->DebugProcess());
        }
        else
#endif
        {
            newOffset = ::Math::PointerCastToIntegral<int>(this->Process());
        }

        this->ClearFlags(InterpreterStackFrameFlags_WithinFinallyBlock);

        bool endOfFinallyBlock = newOffset == 0;
        if (endOfFinallyBlock)
        {
            // Finally completed without taking over the flow. Resume where we left off before calling it.
            int currOffset = ::Math::PointerCastToIntegral<int>(GetNonVarReg(offsetRegSlot));
            m_reader.SetCurrentOffset(currOffset);
        }
        else
        {
            // Finally seized the flow with a jump out of its scope. Resume at the jump target and
            // force the runtime to return to this frame without executing the catch.
            m_reader.SetCurrentOffset(newOffset);
            return;
        }

        Js::JavascriptExceptionObject* exceptionObj = (Js::JavascriptExceptionObject*)GetNonVarReg(exceptionRegSlot);
        if (exceptionObj)
        {
            JavascriptExceptionOperators::DoThrow(exceptionObj, scriptContext);
        }
    }

    template <typename T>
    void InterpreterStackFrame::OP_IsInst(const unaligned T* playout)
    {
        Var instance = GetReg(playout->R1);
        Var function = GetReg(playout->R2);
        IsInstInlineCache *inlineCache = this->GetIsInstInlineCache(playout->inlineCacheIndex);
        ScriptContext* scriptContext = GetScriptContext();

        Var result = JavascriptOperators::OP_IsInst(instance, function, scriptContext, inlineCache);

#ifdef ENABLE_BASIC_TELEMETRY
        {
            this->scriptContext->GetTelemetry().GetOpcodeTelemetry().IsInstanceOf(instance, function, result);
        }
#endif

        SetReg(playout->R0, result);
    }

    template <typename T>
    void InterpreterStackFrame::OP_ApplyArgs(const unaligned OpLayoutT_Reg5<T> * playout)
    {
        // Always save and restore implicit call flags when calling out
        // REVIEW: Can we avoid it if we don't collect dynamic profile info?
        ThreadContext * threadContext = scriptContext->GetThreadContext();
        Js::ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        // Currently ApplyArgs is equivalent to CallFldVoid (where we don't use the return value)
        Var v = GetNonVarReg(playout->R4);
        JavascriptOperators::OP_ApplyArgs(GetReg(playout->R1), GetReg(playout->R2),
            (void**)GetNonVarReg(playout->R3), *((CallInfo*)&v), GetScriptContext());
        threadContext->SetImplicitCallFlags(savedImplicitCallFlags);
    }

    void InterpreterStackFrame::OP_SpreadArrayLiteral(const unaligned OpLayoutReg2Aux * playout)
    {
        ThreadContext* threadContext = this->GetScriptContext()->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        Var instance = GetReg(playout->R1);
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(instance);
#endif
        const Js::AuxArray<uint32> *spreadIndices = m_reader.ReadAuxArray<uint32>(playout->Offset, this->GetFunctionBody());
        ScriptContext* scriptContext = GetScriptContext();
        Var result = JavascriptArray::SpreadArrayArgs(instance, spreadIndices, scriptContext);

        threadContext->CheckAndResetImplicitCallAccessorFlag();
        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);

        SetReg(playout->R0, result);
    }

    FrameDisplay *
        InterpreterStackFrame::OP_LdInnerFrameDisplay(void *argHead, void *argEnv, ScriptContext *scriptContext)
    {
        JavascriptOperators::CheckInnerFrameDisplayArgument(argHead);
        return OP_LdFrameDisplay(argHead, argEnv, scriptContext);
    }

    FrameDisplay *
        InterpreterStackFrame::OP_LdInnerFrameDisplayNoParent(void *argHead, ScriptContext *scriptContext)
    {
        JavascriptOperators::CheckInnerFrameDisplayArgument(argHead);
        return OP_LdFrameDisplayNoParent<true>(argHead, scriptContext);
    }

    FrameDisplay *
        InterpreterStackFrame::OP_LdFrameDisplay(void *argHead, void *argEnv, ScriptContext *scriptContext)
    {
        FrameDisplay *frameDisplay;
        bool strict = this->m_functionBody->GetIsStrictMode();
        if (strict)
        {
            frameDisplay = JavascriptOperators::OP_LdStrictFrameDisplay(argHead, argEnv, scriptContext);
        }
        else
        {
            frameDisplay = JavascriptOperators::OP_LdFrameDisplay(argHead, argEnv, scriptContext);
        }
        return frameDisplay;
    }

    FrameDisplay *
        InterpreterStackFrame::OP_LdFrameDisplaySetLocal(void *argHead, void *argEnv, ScriptContext *scriptContext)
    {
        FrameDisplay *frameDisplay = OP_LdFrameDisplay(argHead, argEnv, scriptContext);
        this->SetLocalFrameDisplay(frameDisplay);
        return frameDisplay;
    }

    FrameDisplay *
        InterpreterStackFrame::NewFrameDisplay(void *argHead, void *argEnv)
    {
        FrameDisplay *frameDisplay;
        bool strict = this->m_functionBody->GetIsStrictMode();

        if (!this->m_functionBody->DoStackFrameDisplay() || !this->GetLocalFrameDisplay())
        {
            // Null local frame display probably indicates that we bailed out of an inlinee.
            // Once we support stack closures in inlined functions, we can just assert that this value
            // is never null if we should be allocating on the stack.
            return this->OP_LdFrameDisplaySetLocal(argHead, argEnv, this->GetScriptContext());
        }

        frameDisplay = this->GetLocalFrameDisplay();
        Assert(frameDisplay != nullptr);

        frameDisplay->SetTag(true);
        frameDisplay->SetStrictMode(strict);
        frameDisplay->SetLength(this->m_functionBody->GetEnvDepth() + 1);
        Assert(frameDisplay->GetLength() == ((FrameDisplay*)argEnv)->GetLength() + 1);

        for (uint i = 0; i < ((FrameDisplay*)argEnv)->GetLength(); i++)
        {
            frameDisplay->SetItem(i + 1, ((FrameDisplay*)argEnv)->GetItem(i));
        }
        frameDisplay->SetItem(0, argHead);

        return frameDisplay;
    }

    template<bool innerFD>
    FrameDisplay *
        InterpreterStackFrame::OP_LdFrameDisplayNoParent(void *argHead, ScriptContext *scriptContext)
    {
        FrameDisplay *frameDisplay;
        bool strict = this->m_functionBody->GetIsStrictMode();

        Var argEnv = nullptr;
        if (innerFD && this->m_functionBody->GetLocalFrameDisplayRegister() != Constants::NoRegister)
        {
            argEnv = this->GetLocalFrameDisplay();
        }
        if (argEnv == nullptr && this->m_functionBody->GetEnvRegister() != Constants::NoRegister)
        {
            argEnv = this->LdEnv();
        }

        if (argEnv == nullptr)
        {
            if (strict)
            {
                frameDisplay = JavascriptOperators::OP_LdStrictFrameDisplayNoParent(argHead, scriptContext);
            }
            else
            {
                frameDisplay = JavascriptOperators::OP_LdFrameDisplayNoParent(argHead, scriptContext);
            }
        }
        else
        {
            if (strict)
            {
                frameDisplay = JavascriptOperators::OP_LdStrictFrameDisplay(argHead, argEnv, scriptContext);
            }
            else
            {
                frameDisplay = JavascriptOperators::OP_LdFrameDisplay(argHead, argEnv, scriptContext);
            }
        }
        return frameDisplay;
    }

    FrameDisplay *
        InterpreterStackFrame::OP_LdFuncExprFrameDisplaySetLocal(void *argHead1, void *argHead2, ScriptContext *scriptContext)
    {
        FrameDisplay *frameDisplay = OP_LdFrameDisplayNoParent<false>(argHead2, scriptContext);
        frameDisplay = OP_LdFrameDisplay(argHead1, frameDisplay, scriptContext);
        this->SetLocalFrameDisplay(frameDisplay);
        return frameDisplay;
    }

    FrameDisplay* InterpreterStackFrame::GetLocalFrameDisplay() const
    {
        Assert(this->localFrameDisplay == nullptr || this->IsClosureInitDone() || this->localFrameDisplay->GetLength() == 0);
        return this->localFrameDisplay;
    }

    void InterpreterStackFrame::SetLocalFrameDisplay(FrameDisplay* frameDisplay)
    {
        this->localFrameDisplay = frameDisplay;
    }

    Var InterpreterStackFrame::GetLocalClosure() const
    {
        return this->localClosure;
    }

    void InterpreterStackFrame::SetLocalClosure(Var closure)
    {
        this->localClosure = closure;
    }

    Var InterpreterStackFrame::GetParamClosure() const
    {
        return this->paramClosure;
    }

    void InterpreterStackFrame::SetParamClosure(Var closure)
    {
        this->paramClosure = closure;
    }

    void
        InterpreterStackFrame::OP_NewInnerScopeSlots(uint innerScopeIndex, uint count, int scopeIndex, ScriptContext *scriptContext, FunctionBody *functionBody)
    {
        Field(Var)* slotArray =
            JavascriptOperators::OP_NewScopeSlotsWithoutPropIds(count, scopeIndex, scriptContext, functionBody);
        this->SetInnerScopeFromIndex(innerScopeIndex, slotArray);
    }

    template <typename T>
    void InterpreterStackFrame::OP_CloneInnerScopeSlots(const unaligned OpLayoutT_Unsigned1<T> *playout)
    {
        uint innerScopeIndex = playout->C1;
        Field(Var) * slotArray;

        slotArray = (Field(Var)*)this->InnerScopeFromIndex(innerScopeIndex);
        slotArray = JavascriptOperators::OP_CloneScopeSlots(slotArray, scriptContext);
        this->SetInnerScopeFromIndex(innerScopeIndex, slotArray);
    }

    template <typename T>
    void InterpreterStackFrame::OP_CloneBlockScope(const unaligned OpLayoutT_Unsigned1<T> *playout)
    {
        uint innerScopeIndex = playout->C1;
        Var scope = this->InnerScopeFromIndex(innerScopeIndex);
        BlockActivationObject* blockScope = VarTo<BlockActivationObject>(scope);

        scope = JavascriptOperators::OP_CloneBlockScope(blockScope, scriptContext);
        this->SetInnerScopeFromIndex(innerScopeIndex, scope);
    }

    Field(Var)*
        InterpreterStackFrame::NewScopeSlots(unsigned int size, ScriptContext *scriptContext, Var scope)
    {
        Field(Var)* slotArray = JavascriptOperators::OP_NewScopeSlots(size, scriptContext, scope);
        this->SetLocalClosure(slotArray);
        return slotArray;
    }

    Field(Var)*
        InterpreterStackFrame::NewScopeSlots()
    {
        Field(Var)* slotArray;
        FunctionBody * functionBody = this->m_functionBody;
        uint scopeSlotCount = this->IsParamScopeDone() ? functionBody->scopeSlotArraySize : functionBody->paramScopeSlotArraySize;
        Assert(scopeSlotCount != 0);

        if (!functionBody->DoStackScopeSlots())
        {
            return this->NewScopeSlots(
                scopeSlotCount + ScopeSlots::FirstSlotIndex, this->GetScriptContext(), (Var)functionBody->GetFunctionInfo());
        }

        slotArray = (Field(Var)*)this->GetLocalClosure();
        Assert(slotArray != nullptr);

        ScopeSlots scopeSlots(slotArray);
        scopeSlots.SetCount(scopeSlotCount);
        scopeSlots.SetScopeMetadata((Var)functionBody->GetFunctionInfo());
        Var undef = functionBody->GetScriptContext()->GetLibrary()->GetUndefined();
        for (unsigned int i = 0; i < scopeSlotCount; i++)
        {
            scopeSlots.Set(i, undef);
        }

        return slotArray;
    }

    Var
        InterpreterStackFrame::NewScopeObject()
    {
        Var scopeObject;

        if (m_functionBody->HasCachedScopePropIds())
        {
            const Js::PropertyIdArray *propIds = this->m_functionBody->GetFormalsPropIdArray();

            JavascriptFunction* funcExpr = this->GetFunctionExpression();
            PropertyId objectId = ActivationObjectEx::GetLiteralObjectRef(propIds);
            scopeObject = JavascriptOperators::OP_InitCachedScope(funcExpr, propIds,
                this->GetFunctionBody()->GetObjectLiteralTypeRef(objectId),
                propIds->hasNonSimpleParams, GetScriptContext());

        }
        else
        {
            scopeObject = JavascriptOperators::OP_NewScopeObject(GetScriptContext());
        }
        this->SetLocalClosure(scopeObject);
        return scopeObject;
    }

    FrameDisplay *
        InterpreterStackFrame::GetFrameDisplayForNestedFunc() const
    {
        if (this->localFrameDisplay == nullptr)
        {
            return (FrameDisplay*)LdEnv();
        }
        return this->localFrameDisplay;
    }

    template <class T>
    void InterpreterStackFrame::OP_NewStackScFunc(const unaligned T * playout)
    {
        uint funcIndex = playout->SlotIndex;
        FrameDisplay *frameDisplay = this->GetFrameDisplayForNestedFunc();
        SetRegAllowStackVarEnableOnly(playout->Value,
            StackScriptFunction::OP_NewStackScFunc(frameDisplay,
                this->m_functionBody->GetNestedFuncReference(funcIndex),
                this->GetStackNestedFunction(funcIndex)));
    }

    template <class T>
    void InterpreterStackFrame::OP_NewInnerStackScFunc(const unaligned T * playout)
    {
        uint funcIndex = playout->SlotIndex;
        FrameDisplay *frameDisplay = (FrameDisplay*)GetNonVarReg(playout->Instance);
        SetRegAllowStackVarEnableOnly(playout->Value,
            StackScriptFunction::OP_NewStackScFunc(frameDisplay,
                this->m_functionBody->GetNestedFuncReference(funcIndex),
                this->GetStackNestedFunction(funcIndex)));
    }

    template <class T>
    void InterpreterStackFrame::OP_DeleteFld(const unaligned T * playout)
    {
        Var result = JavascriptOperators::OP_DeleteProperty(GetReg(playout->Instance), m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex), GetScriptContext());
        SetReg(playout->Value, result);
    }

    template <class T>
    void InterpreterStackFrame::OP_DeleteLocalFld(const unaligned T * playout)
    {
        Var result = JavascriptOperators::OP_DeleteProperty(this->localClosure, m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex), GetScriptContext());
        SetReg(playout->Instance, result);
    }

    template <class T>
    void InterpreterStackFrame::OP_DeleteRootFld(const unaligned T * playout)
    {
        Var result = JavascriptOperators::OP_DeleteRootProperty(GetReg(playout->Instance), m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex), GetScriptContext());
        SetReg(playout->Value, result);
    }

    template <class T>
    void InterpreterStackFrame::OP_DeleteFldStrict(const unaligned T * playout)
    {
        Var result = JavascriptOperators::OP_DeleteProperty(GetReg(playout->Instance), m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex), GetScriptContext(), PropertyOperation_StrictMode);
        SetReg(playout->Value, result);
    }

    template <class T>
    void InterpreterStackFrame::OP_DeleteRootFldStrict(const unaligned T * playout)
    {
        Var result = JavascriptOperators::OP_DeleteRootProperty(GetReg(playout->Instance), m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex), GetScriptContext(), PropertyOperation_StrictMode);
        SetReg(playout->Value, result);
    }

    template <typename T>
    void InterpreterStackFrame::OP_ScopedDeleteFld(const unaligned OpLayoutT_ElementScopedC<T> * playout)
    {
        // Implicit root object as default instance
        Var result = JavascriptOperators::OP_DeletePropertyScoped(GetEnvForEvalCode(),
            m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex),
            GetReg(Js::FunctionBody::RootObjectRegSlot), GetScriptContext());
        SetReg(playout->Value, result);
    }

    template <typename T>
    void InterpreterStackFrame::OP_ScopedDeleteFldStrict(const unaligned OpLayoutT_ElementScopedC<T> * playout)
    {
        // Implicit root object as default instance
        Var result = JavascriptOperators::OP_DeletePropertyScoped(GetEnvForEvalCode(),
            m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex),
            GetReg(Js::FunctionBody::RootObjectRegSlot), GetScriptContext(), PropertyOperation_StrictMode);
        SetReg(playout->Value, result);
    }

    template <class T>
    void InterpreterStackFrame::OP_ScopedLdInst(const unaligned T * playout)
    {
        Var thisVar = nullptr;
        Var rootObject = GetFunctionBody()->GetRootObject();
        Var result = JavascriptOperators::OP_GetInstanceScoped(GetEnvForEvalCode(),
            m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex), rootObject, &thisVar, GetScriptContext());
        SetReg(playout->Value, result);
        SetReg(playout->Value2, thisVar);
    }

    template <typename T>
    void InterpreterStackFrame::OP_ScopedInitFunc(const unaligned OpLayoutT_ElementScopedC<T> * playout)
    {
        JavascriptOperators::OP_InitFuncScoped(GetEnvForEvalCode(),
            m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex),
            GetReg(playout->Value), GetReg(Js::FunctionBody::RootObjectRegSlot), GetScriptContext());
    }

    template <class T>
    void InterpreterStackFrame::OP_ClearAttributes(const unaligned T * playout)
    {
        JavascriptOperators::OP_ClearAttributes(GetReg(playout->Instance), m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex));
    }

    template <class T>
    void InterpreterStackFrame::OP_InitGetFld(const unaligned T * playout)
    {
        JavascriptOperators::OP_InitGetter(GetReg(playout->Instance), m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex), GetReg(playout->Value));
    }

    template <class T>
    void InterpreterStackFrame::OP_InitSetFld(const unaligned T * playout)
    {
        JavascriptOperators::OP_InitSetter(GetReg(playout->Instance), m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex), GetReg(playout->Value));
    }

    template <class T>
    void InterpreterStackFrame::OP_InitSetElemI(const unaligned T * playout)
    {
        JavascriptOperators::OP_InitElemSetter(
            GetReg(playout->Instance),
            GetReg(playout->Element),
            GetReg(playout->Value),
            m_functionBody->GetScriptContext()
        );
    }

    template <class T>
    void InterpreterStackFrame::OP_InitGetElemI(const unaligned T * playout)
    {
        JavascriptOperators::OP_InitElemGetter(
            GetReg(playout->Instance),
            GetReg(playout->Element),
            GetReg(playout->Value),
            m_functionBody->GetScriptContext()
        );
    }

    template <class T>
    void InterpreterStackFrame::OP_InitComputedProperty(const unaligned T * playout)
    {
        JavascriptOperators::OP_InitComputedProperty(
            GetReg(playout->Instance),
            GetReg(playout->Element),
            GetReg(playout->Value),
            m_functionBody->GetScriptContext()
        );
    }

    template <class T>
    void InterpreterStackFrame::OP_InitProto(const unaligned T * playout)
    {
        JavascriptOperators::OP_InitProto(GetReg(playout->Instance), m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex), GetReg(playout->Value));
    }

    void InterpreterStackFrame::DoInterruptProbe()
    {
        PROBE_STACK(scriptContext, 0);
    }

    void InterpreterStackFrame::InitializeStackFunctions(StackScriptFunction * scriptFunctions)
    {
        this->stackNestedFunctions = scriptFunctions;
        FunctionBody * functionBody = this->m_functionBody;
        uint nestedCount = functionBody->GetNestedCount();
        for (uint i = 0; i < nestedCount; i++)
        {
            StackScriptFunction * stackScriptFunction = scriptFunctions + i;
            FunctionProxy* nestedProxy = functionBody->GetNestedFunctionProxy(i);
            ScriptFunctionType* type = nestedProxy->EnsureDeferredPrototypeType();
            new (stackScriptFunction)StackScriptFunction(nestedProxy, type);
        }
    }

    StackScriptFunction * InterpreterStackFrame::GetStackNestedFunction(uint index)
    {
        Assert(index < this->m_functionBody->GetNestedCount());
        // Re-check if we have disable stack nested function
        if (this->m_functionBody->DoStackNestedFunc())
        {
            return this->stackNestedFunctions + index;
        }
        return nullptr;
    }

    void InterpreterStackFrame::SetExecutingStackFunction(ScriptFunction * scriptFunction)
    {
        Assert(ThreadContext::IsOnStack(this->function));
        Assert(this->m_functionBody == scriptFunction->GetFunctionBody());
        this->function = scriptFunction;
    }

    DWORD_PTR InterpreterStackFrame::GetStackAddress() const
    {
        return m_stackAddress;
    }

    void* InterpreterStackFrame::GetAddressOfReturnAddress() const
    {
        return this->addressOfReturnAddress;
    }

    template <class T>
    const byte * InterpreterStackFrame::OP_Br(const unaligned T * playout)
    {
        return m_reader.SetCurrentRelativeOffset((const byte *)(playout + 1), playout->RelativeJumpOffset);
    }

    Var InterpreterStackFrame::OP_InitBaseClass(FrameDisplay *environment, FunctionInfoPtrPtr infoRef, RegSlot protoReg)
    {
        RecyclableObject * protoParent = scriptContext->GetLibrary()->GetObjectPrototype();
        RecyclableObject * constructorParent = scriptContext->GetLibrary()->GetFunctionPrototype();

        return InitClassHelper(environment, infoRef, protoParent, constructorParent, protoReg);
    }

    Var InterpreterStackFrame::OP_InitClass(FrameDisplay *environment, FunctionInfoPtrPtr infoRef, Var constructorParent, Var protoParent, RegSlot protoReg)
    {
        return InitClassHelper(environment, infoRef, VarTo<RecyclableObject>(protoParent), VarTo<RecyclableObject>(constructorParent), protoReg);
    }

    Var InterpreterStackFrame::InitClassHelper(FrameDisplay *environment, FunctionInfoPtrPtr infoRef, RecyclableObject *protoParent, RecyclableObject *constructorParent, RegSlot protoReg)
    {
        Assert(protoParent && JavascriptOperators::IsObjectOrNull(protoParent));
        Assert(constructorParent && (JavascriptOperators::IsConstructor(constructorParent) || constructorParent == scriptContext->GetLibrary()->GetFunctionPrototype()));

        // Create prototype object with the default class prototype object shape {'constructor': W:T, E:F, C:T} and [[Prototype]] == protoParent
        DynamicObject * proto = scriptContext->GetLibrary()->CreateClassPrototypeObject(protoParent);

        // Create class constructor object for the constructor function, with default constructor shape:
        //    {'prototype': W:F, E:F, C:F}, {'length': W:F, E:F, C:T}, {'name': W:F, E:F, C:T}
        //    [[Prototype]] == constructorParent and [[HomeObject]] == proto
        // The callee initializes the object and the 3 properties.
        ScriptFunction * constructor = ScriptFunction::OP_NewClassConstructor(environment, infoRef, proto, constructorParent);

        proto->SetSlot(SetSlotArguments(Constants::NoProperty, 0, constructor));
        constructor->SetSlot(SetSlotArguments(Constants::NoProperty, 0, proto));

        SetReg(protoReg, proto);
        return constructor;
    }

#ifdef ENABLE_SCRIPT_DEBUGGING
    template <class T>
    void InterpreterStackFrame::OP_EmitTmpRegCount(const unaligned OpLayoutT_Unsigned1<T> * playout)
    {
        this->scriptContext->GetDebugContext()->GetProbeContainer()->SetCurrentTmpRegCount(playout->C1);
    }
#endif

    Var InterpreterStackFrame::OP_LdHomeObj(ScriptContext * scriptContext)
    {
        return JavascriptOperators::OP_LdHomeObj(function, scriptContext);
    }

    Var InterpreterStackFrame::OP_LdFuncObj(ScriptContext * scriptContext)
    {
        return JavascriptOperators::OP_LdFuncObj(function, scriptContext);
    }

    Var InterpreterStackFrame::OP_ImportCall(Var specifier, ScriptContext *scriptContext)
    {
        return JavascriptOperators::OP_ImportCall(function, specifier, scriptContext);
    }

    void InterpreterStackFrame::ValidateRegValue(Var value, bool allowStackVar, bool allowStackVarOnDisabledStackNestedFunc) const
    {
#if DBG
        if (value != nullptr && !TaggedNumber::Is(value))
        {
            if (!allowStackVar || !this->m_functionBody->DoStackNestedFunc())
            {
                Assert(!ThreadContext::IsOnStack(value)
                    || (allowStackVar && allowStackVarOnDisabledStackNestedFunc && StackScriptFunction::IsBoxed(value)));
            }
            Assert(!CrossSite::NeedMarshalVar(value, GetScriptContext()));
        }
#endif
    }

    template <typename RegSlotType>
    Var InterpreterStackFrame::GetReg(RegSlotType localRegisterID) const
    {
        Var value = m_localSlots[localRegisterID];
        ValidateRegValue(value);
        return value;
    }

    template <typename RegSlotType>
    void InterpreterStackFrame::SetReg(RegSlotType localRegisterID, Var value)
    {
        Assert(localRegisterID == 0 || localRegisterID >= m_functionBody->GetConstantCount());
        ValidateRegValue(value);
        m_localSlots[localRegisterID] = value;

#if ENABLE_OBJECT_SOURCE_TRACKING
        if (value != nullptr && DynamicType::Is(Js::JavascriptOperators::GetTypeId(value)))
        {
            static_cast<DynamicObject*>(value)->SetDiagOriginInfoAsNeeded();
        }
#endif

#if ENABLE_VALUE_TRACE
        if (this->function->GetScriptContext()->ShouldPerformRecordOrReplayAction())
        {
            this->function->GetScriptContext()->GetThreadContext()->TTDExecutionInfo->GetTraceLogger()->WriteTraceValue(value);
        }
#endif
    }

    template <typename T>
    T InterpreterStackFrame::GetRegRaw(RegSlot localRegisterID) const
    {
        return (T)m_localIntSlots[localRegisterID];
    }

    // specialized version for doubles
    template <>
    double VECTORCALL InterpreterStackFrame::GetRegRaw(RegSlot localRegisterID) const
    {
        return (double)m_localDoubleSlots[localRegisterID];
    }

    template <>
    float VECTORCALL InterpreterStackFrame::GetRegRaw(RegSlot localRegisterID) const
    {
        return (float)m_localFloatSlots[localRegisterID];
    }

    template <>
    int64 InterpreterStackFrame::GetRegRaw(RegSlot localRegisterID) const
    {
        return m_localInt64Slots[localRegisterID];
    }

    template <typename T>
    void InterpreterStackFrame::SetRegRaw(RegSlot localRegisterID, T bValue)
    {
        m_localIntSlots[localRegisterID] = (int)bValue;
    }

    template <>
    void InterpreterStackFrame::SetRegRaw(RegSlot localRegisterID, float bValue)
    {
        m_localFloatSlots[localRegisterID] = (float)bValue;
    }

    template <>
    void InterpreterStackFrame::SetRegRaw(RegSlot localRegisterID, double bValue)
    {
        m_localDoubleSlots[localRegisterID] = bValue;
    }

    template <>
    void InterpreterStackFrame::SetRegRaw(RegSlot localRegisterID, int64 bValue)
    {
        m_localInt64Slots[localRegisterID] = bValue;
    }

    template <typename RegSlotType>
    int InterpreterStackFrame::GetRegRawInt(RegSlotType localRegisterID) const
    {
        return m_localIntSlots[localRegisterID];
    }
    template <typename RegSlotType>
    double InterpreterStackFrame::GetRegRawDouble(RegSlotType localRegisterID) const
    {
        return m_localDoubleSlots[localRegisterID];
    }

    template <typename RegSlotType>
    float InterpreterStackFrame::GetRegRawFloat(RegSlotType localRegisterID) const
    {
        return m_localFloatSlots[localRegisterID];
    }

    template <typename RegSlotType>
    void InterpreterStackFrame::SetRegRawInt(RegSlotType localRegisterID, int bValue)
    {
        m_localIntSlots[localRegisterID] = bValue;
    }

    template <typename RegSlotType>
    int64 InterpreterStackFrame::GetRegRawInt64(RegSlotType localRegisterID) const
    {
        return m_localInt64Slots[localRegisterID];
    }

    template <typename RegSlotType>
    void* InterpreterStackFrame::GetRegRawPtr(RegSlotType localRegisterID) const
    {
#if TARGET_32
        return (void*)m_localIntSlots[localRegisterID];
#elif TARGET_64
        return (void*)m_localInt64Slots[localRegisterID];
#endif
    }

    template <typename RegSlotType>
    void InterpreterStackFrame::SetRegRawPtr(RegSlotType localRegisterID, void* val)
    {
#if TARGET_32
        m_localIntSlots[localRegisterID] = (int32)val;
#elif TARGET_64
        m_localInt64Slots[localRegisterID] = (int64)val;
#endif
    }

    template <typename RegSlotType>
    void InterpreterStackFrame::SetRegRawInt64(RegSlotType localRegisterID, int64 bValue)
    {
        m_localInt64Slots[localRegisterID] = bValue;
    }

    template <typename RegSlotType>
    void InterpreterStackFrame::SetRegRawDouble(RegSlotType localRegisterID, double bValue)
    {
        m_localDoubleSlots[localRegisterID] = bValue;
    }

    template <typename RegSlotType>
    void InterpreterStackFrame::SetRegRawFloat(RegSlotType localRegisterID, float bValue)
    {
        m_localFloatSlots[localRegisterID] = bValue;
    }

    template <typename RegSlotType>
    Var InterpreterStackFrame::GetRegAllowStackVar(RegSlotType localRegisterID) const
    {
        Var value = m_localSlots[localRegisterID];
        ValidateRegValue(value, true);
        return value;
    }

    template <typename RegSlotType>
    void InterpreterStackFrame::SetRegAllowStackVar(RegSlotType localRegisterID, Var value)
    {
        Assert(localRegisterID == 0 || localRegisterID >= m_functionBody->GetConstantCount());
        ValidateRegValue(value, true);
        m_localSlots[localRegisterID] = value;

#if ENABLE_OBJECT_SOURCE_TRACKING
        if (value != nullptr && DynamicType::Is(Js::JavascriptOperators::GetTypeId(value)))
        {
            static_cast<DynamicObject*>(value)->SetDiagOriginInfoAsNeeded();
        }
#endif

#if ENABLE_VALUE_TRACE
        if (this->function->GetScriptContext()->ShouldPerformRecordOrReplayAction())
        {
            this->function->GetScriptContext()->GetThreadContext()->TTDExecutionInfo->GetTraceLogger()->WriteTraceValue(value);
        }
#endif
    }

    template <typename RegSlotType>
    Var InterpreterStackFrame::GetRegAllowStackVarEnableOnly(RegSlotType localRegisterID) const
    {
        Var value = m_localSlots[localRegisterID];
        ValidateRegValue(value, true, false);
        return value;
    }

    template <typename RegSlotType>
    void InterpreterStackFrame::SetRegAllowStackVarEnableOnly(RegSlotType localRegisterID, Var value)
    {
        Assert(localRegisterID == 0 || localRegisterID >= m_functionBody->GetConstantCount());
        ValidateRegValue(value, true, false);
        m_localSlots[localRegisterID] = value;

#if ENABLE_OBJECT_SOURCE_TRACKING
        if (value != nullptr && DynamicType::Is(Js::JavascriptOperators::GetTypeId(value)))
        {
            static_cast<DynamicObject*>(value)->SetDiagOriginInfoAsNeeded();
        }
#endif

#if ENABLE_VALUE_TRACE
        if (this->function->GetScriptContext()->ShouldPerformRecordOrReplayAction())
        {
            this->function->GetScriptContext()->GetThreadContext()->TTDExecutionInfo->GetTraceLogger()->WriteTraceValue(value);
        }
#endif
    }

    template <>
    AsmJsSIMDValue InterpreterStackFrame::GetRegRaw(RegSlot localRegisterID) const
    {
        return (AsmJsSIMDValue)m_localSimdSlots[localRegisterID];
    }

    template<>
    void InterpreterStackFrame::SetRegRaw(RegSlot localRegisterID, AsmJsSIMDValue bValue)
    {
        m_localSimdSlots[localRegisterID] = bValue;
    }

    template <typename RegSlotType>
    AsmJsSIMDValue InterpreterStackFrame::GetRegRawSimd(RegSlotType localRegisterID) const
    {
        return m_localSimdSlots[localRegisterID];
    }

    template <typename RegSlotType>
    void InterpreterStackFrame::SetRegRawSimd(RegSlotType localRegisterID, AsmJsSIMDValue bValue)
    {
        m_localSimdSlots[localRegisterID] = bValue;
    }

    int InterpreterStackFrame::OP_GetMemorySize()
    {
#ifdef ENABLE_WASM
        return (int)GetWebAssemblyMemory()->GetCurrentMemoryPages();
#else
        Assert(UNREACHED);
        return 0;
#endif
    }

    int InterpreterStackFrame::OP_GrowMemory(int32 delta)
    {
#ifdef ENABLE_WASM
        return GetWebAssemblyMemory()->GrowInternal((uint32)delta);
#else
        Assert(UNREACHED);
        return 0;
#endif
    }

    template <typename T, InterpreterStackFrame::AsmJsMathPtr<T> func> T InterpreterStackFrame::OP_UnsignedDivRemCheck(T aLeft, T aRight, ScriptContext* scriptContext)
    {
        if (aRight == 0)
        {
            JavascriptError::ThrowWebAssemblyRuntimeError(scriptContext, WASMERR_DivideByZero);
        }

        return func(aLeft, aRight);
    }

    template <typename T, InterpreterStackFrame::AsmJsMathPtr<T> func> T InterpreterStackFrame::OP_DivOverflow(T aLeft, T aRight, ScriptContext* scriptContext)
    {
        if (aRight == 0)
        {
            JavascriptError::ThrowWebAssemblyRuntimeError(scriptContext, WASMERR_DivideByZero);
        }

        if (aLeft == SignedTypeTraits<T>::MinValue && aRight == -1)
        {
            JavascriptError::ThrowWebAssemblyRuntimeError(scriptContext, VBSERR_Overflow);
        }

        return func(aLeft, aRight);
    }

    template <typename T, InterpreterStackFrame::AsmJsMathPtr<T> func> T InterpreterStackFrame::OP_RemOverflow(T aLeft, T aRight, ScriptContext* scriptContext)
    {
        if (aRight == 0)
        {
            JavascriptError::ThrowWebAssemblyRuntimeError(scriptContext, WASMERR_DivideByZero);
        }

        if (aLeft == SignedTypeTraits<T>::MinValue && aRight == -1)
        {
            return 0;
        }

        return func(aLeft, aRight);
    }

    void InterpreterStackFrame::OP_Unreachable()
    {
        JavascriptError::ThrowUnreachable(scriptContext);
    }

    template <class T>
    void InterpreterStackFrame::OP_SimdLdArrGeneric(const unaligned T* playout)
    {
        Assert(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT);

        if (GetRegRawInt(playout->SlotIndex) < 0) {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange, _u("Simd typed array access"));
        }

        const uint64 index = (uint64)GetRegRawInt(playout->SlotIndex) + playout->Offset;

        ArrayBufferBase* arr =
#ifdef ENABLE_WASM_SIMD
        (m_functionBody->IsWasmFunction()) ?
            m_wasmMemory->GetBuffer() :
#endif
            GetAsmJsBuffer();

        BYTE* buffer = arr->GetBuffer();
        uint8 dataWidth = playout->DataWidth;
        RegSlot dstReg = playout->Value;
        if (index + dataWidth > arr->GetByteLength())
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange, _u("Simd typed array access"));
        }
        AsmJsSIMDValue *data = (AsmJsSIMDValue*)(buffer + index);
        AsmJsSIMDValue value;

        value = SIMDUtils::SIMDLdData(data, dataWidth);
        SetRegRawSimd(dstReg, value);
    }

    template <class T>
    void InterpreterStackFrame::OP_SimdLdArrConstIndex(const unaligned T* playout)
    {
        Assert(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT);
        const uint64 index = (uint32)playout->SlotIndex;
        JavascriptArrayBuffer* arr = GetAsmJsBuffer();
        BYTE* buffer = arr->GetBuffer();
        uint8 dataWidth = playout->DataWidth;
        RegSlot dstReg = playout->Value;

        if (index + dataWidth > arr->GetByteLength())
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange, _u("Simd typed array access"));
        }
        AsmJsSIMDValue *data = (AsmJsSIMDValue*)(buffer + index);
        AsmJsSIMDValue value;

        value = SIMDUtils::SIMDLdData(data, dataWidth);
        SetRegRawSimd(dstReg, value);
    }

    template <class T>
    void InterpreterStackFrame::OP_SimdStArrGeneric(const unaligned T* playout)
    {
        Assert(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT);

        if (GetRegRawInt(playout->SlotIndex) < 0)
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange, _u("Simd typed array access"));
        }
        const uint64 index = (uint64)GetRegRawInt(playout->SlotIndex) + playout->Offset;

        ArrayBufferBase* arr =
#ifdef ENABLE_WASM_SIMD
        (m_functionBody->IsWasmFunction()) ?
            m_wasmMemory->GetBuffer() :
#endif
            GetAsmJsBuffer();

        BYTE* buffer = arr->GetBuffer();
        uint8 dataWidth = playout->DataWidth;
        RegSlot srcReg = playout->Value;

        if (index + dataWidth > arr->GetByteLength())
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange, _u("Simd typed array access"));
        }
        AsmJsSIMDValue *data = (AsmJsSIMDValue*)(buffer + index);
        AsmJsSIMDValue value = GetRegRawSimd(srcReg);
        SIMDUtils::SIMDStData(data, value, dataWidth);
    }

    template <class T>
    void InterpreterStackFrame::OP_SimdStArrConstIndex(const unaligned T* playout)
    {
        Assert(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT);
        const uint64 index = (uint32)playout->SlotIndex;
        JavascriptArrayBuffer* arr = GetAsmJsBuffer();
        BYTE* buffer = arr->GetBuffer();
        uint8 dataWidth = playout->DataWidth;
        RegSlot srcReg = playout->Value;

        if (index + dataWidth > arr->GetByteLength())
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange, _u("Simd typed array access"));
        }
        AsmJsSIMDValue *data = (AsmJsSIMDValue*)(buffer + index);
        AsmJsSIMDValue value = GetRegRawSimd(srcReg);
        SIMDUtils::SIMDStData(data, value, dataWidth);

    }


    bool InterpreterStackFrame::SIMDAnyNaN(AsmJsSIMDValue& input)
    {
        if (!GetFunctionBody()->IsWasmFunction())
        {
            return false;
        }

        AsmJsSIMDValue compResult = SIMDFloat32x4Operation::OpEqual(input, input);
        return !SIMDBool32x4Operation::OpAllTrue(compResult);
    }

    // handler for SIMD.Int32x4.FromFloat32x4
    template <class T>
    void InterpreterStackFrame::OP_SimdInt32x4FromFloat32x4(const unaligned T* playout)
    {
        bool throws = false;
        AsmJsSIMDValue input = GetRegRawSimd(playout->F4_1);
        AsmJsSIMDValue result{ 0 };

#ifdef ENABLE_WASM_SIMD
        throws = SIMDAnyNaN(input);
        if (!throws)
#endif
        {
            result = SIMDInt32x4Operation::OpFromFloat32x4(input, throws);
        }

        // value is out of bound
        if (throws)
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange, _u("SIMD.Int32x4.FromFloat32x4"));
        }
        SetRegRawSimd(playout->I4_0, result);
    }
    // handler for SIMD.Uint32x4.FromFloat32x4
    template <class T>
    void InterpreterStackFrame::OP_SimdUint32x4FromFloat32x4(const unaligned T* playout)
    {
        bool throws = false;
        AsmJsSIMDValue input = GetRegRawSimd(playout->F4_1);
        AsmJsSIMDValue result{ 0 };

#ifdef ENABLE_WASM_SIMD
        throws = SIMDAnyNaN(input);
        if (!throws)
#endif
        {
            result = SIMDUint32x4Operation::OpFromFloat32x4(input, throws);
        }

        if (throws)
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange, _u("SIMD.Int32x4.FromFloat32x4"));
        }
        SetRegRawSimd(playout->U4_0, result);
    }

    template <class T>
    void InterpreterStackFrame::OP_WasmSimdConst(const unaligned T* playout)
    {
        AsmJsSIMDValue result{ playout->C1, playout->C2, playout->C3, playout->C4 };
        SetRegRawSimd(playout->F4_0, result);
    }

    template <class T>
    void InterpreterStackFrame::OP_SimdShuffleV8X16(const unaligned T* playout)
    {
        uint32 lanes[Wasm::Simd::MAX_LANES];
        for (uint32 i = 0; i < Wasm::Simd::MAX_LANES; i++)
        {
            Assert(playout->INDICES[i] < Wasm::Simd::MAX_LANES * 2);
            lanes[i] = playout->INDICES[i];
        }
        SetRegRawSimd(playout->R0, SIMDUtils::SIMD128InnerShuffle(GetRegRawSimd(playout->R1), GetRegRawSimd(playout->R2), Wasm::Simd::MAX_LANES, lanes));
    }

    template <class T>
    void InterpreterStackFrame::OP_SimdInt16x8(const unaligned T* playout)
    {
        int16 values[8];
        values[0] = (int16)GetRegRawInt(playout->I1);
        values[1] = (int16)GetRegRawInt(playout->I2);
        values[2] = (int16)GetRegRawInt(playout->I3);
        values[3] = (int16)GetRegRawInt(playout->I4);
        values[4] = (int16)GetRegRawInt(playout->I5);
        values[5] = (int16)GetRegRawInt(playout->I6);
        values[6] = (int16)GetRegRawInt(playout->I7);
        values[7] = (int16)GetRegRawInt(playout->I8);

        AsmJsSIMDValue result = SIMDInt16x8Operation::OpInt16x8(values);
        SetRegRawSimd(playout->I8_0, result);
    }

    template <class T>
    void InterpreterStackFrame::OP_SimdInt8x16(const unaligned T* playout)
    {
        int8 values[16];
        values[0] = (int8)GetRegRawInt(playout->I1);
        values[1] = (int8)GetRegRawInt(playout->I2);
        values[2] = (int8)GetRegRawInt(playout->I3);
        values[3] = (int8)GetRegRawInt(playout->I4);
        values[4] = (int8)GetRegRawInt(playout->I5);
        values[5] = (int8)GetRegRawInt(playout->I6);
        values[6] = (int8)GetRegRawInt(playout->I7);
        values[7] = (int8)GetRegRawInt(playout->I8);
        values[8] = (int8)GetRegRawInt(playout->I9);
        values[9] = (int8)GetRegRawInt(playout->I10);
        values[10] = (int8)GetRegRawInt(playout->I11);
        values[11] = (int8)GetRegRawInt(playout->I12);
        values[12] = (int8)GetRegRawInt(playout->I13);
        values[13] = (int8)GetRegRawInt(playout->I14);
        values[14] = (int8)GetRegRawInt(playout->I15);
        values[15] = (int8)GetRegRawInt(playout->I16);

        AsmJsSIMDValue result = SIMDInt8x16Operation::OpInt8x16(values);
        SetRegRawSimd(playout->I16_0, result);
    }

    template <class T>
    void InterpreterStackFrame::OP_SimdUint16x8(const unaligned T* playout)
    {

        uint16 values[8];
        values[0] = (uint16)GetRegRawInt(playout->I1);
        values[1] = (uint16)GetRegRawInt(playout->I2);
        values[2] = (uint16)GetRegRawInt(playout->I3);
        values[3] = (uint16)GetRegRawInt(playout->I4);
        values[4] = (uint16)GetRegRawInt(playout->I5);
        values[5] = (uint16)GetRegRawInt(playout->I6);
        values[6] = (uint16)GetRegRawInt(playout->I7);
        values[7] = (uint16)GetRegRawInt(playout->I8);

        AsmJsSIMDValue result = SIMDUint16x8Operation::OpUint16x8(values);
        SetRegRawSimd(playout->U8_0, result);
    }

    template <class T>
    void InterpreterStackFrame::OP_SimdUint8x16(const unaligned T* playout)
    {
        uint8 values[16];
        values[0] = (uint8)GetRegRawInt(playout->I1);
        values[1] = (uint8)GetRegRawInt(playout->I2);
        values[2] = (uint8)GetRegRawInt(playout->I3);
        values[3] = (uint8)GetRegRawInt(playout->I4);
        values[4] = (uint8)GetRegRawInt(playout->I5);
        values[5] = (uint8)GetRegRawInt(playout->I6);
        values[6] = (uint8)GetRegRawInt(playout->I7);
        values[7] = (uint8)GetRegRawInt(playout->I8);
        values[8] = (uint8)GetRegRawInt(playout->I9);
        values[9] = (uint8)GetRegRawInt(playout->I10);
        values[10] = (uint8)GetRegRawInt(playout->I11);
        values[11] = (uint8)GetRegRawInt(playout->I12);
        values[12] = (uint8)GetRegRawInt(playout->I13);
        values[13] = (uint8)GetRegRawInt(playout->I14);
        values[14] = (uint8)GetRegRawInt(playout->I15);
        values[15] = (uint8)GetRegRawInt(playout->I16);

        AsmJsSIMDValue result = SIMDUint8x16Operation::OpUint8x16(values);
        SetRegRawSimd(playout->U16_0, result);
    }

    // Bool constructors
    template <class T>
    void InterpreterStackFrame::OP_SimdBool32x4(const unaligned T* playout)
    {
        bool arg1 = GetRegRawInt(playout->I1) ? true : false;
        bool arg2 = GetRegRawInt(playout->I2) ? true : false;
        bool arg3 = GetRegRawInt(playout->I3) ? true : false;
        bool arg4 = GetRegRawInt(playout->I4) ? true : false;
        AsmJsSIMDValue result = SIMDBool32x4Operation::OpBool32x4(arg1, arg2, arg3, arg4);
        SetRegRawSimd(playout->B4_0, result);

    }

    template <class T>
    void InterpreterStackFrame::OP_SimdBool16x8(const unaligned T* playout)
    {
        bool values[8];
        values[0] = GetRegRawInt(playout->I1) ? true : false;
        values[1] = GetRegRawInt(playout->I2) ? true : false;
        values[2] = GetRegRawInt(playout->I3) ? true : false;
        values[3] = GetRegRawInt(playout->I4) ? true : false;
        values[4] = GetRegRawInt(playout->I5) ? true : false;
        values[5] = GetRegRawInt(playout->I6) ? true : false;
        values[6] = GetRegRawInt(playout->I7) ? true : false;
        values[7] = GetRegRawInt(playout->I8) ? true : false;

        AsmJsSIMDValue result = SIMDBool16x8Operation::OpBool16x8(values);
        SetRegRawSimd(playout->B8_0, result);
    }

    template <class T>
    void InterpreterStackFrame::OP_SimdBool8x16(const unaligned T* playout)
    {
        bool values[16];
        values[0] = GetRegRawInt(playout->I1) ? true : false;
        values[1] = GetRegRawInt(playout->I2) ? true : false;
        values[2] = GetRegRawInt(playout->I3) ? true : false;
        values[3] = GetRegRawInt(playout->I4) ? true : false;
        values[4] = GetRegRawInt(playout->I5) ? true : false;
        values[5] = GetRegRawInt(playout->I6) ? true : false;
        values[6] = GetRegRawInt(playout->I7) ? true : false;
        values[7] = GetRegRawInt(playout->I8) ? true : false;
        values[8] = GetRegRawInt(playout->I9) ? true : false;
        values[9] = GetRegRawInt(playout->I10) ? true : false;
        values[10] = GetRegRawInt(playout->I11) ? true : false;
        values[11] = GetRegRawInt(playout->I12) ? true : false;
        values[12] = GetRegRawInt(playout->I13) ? true : false;
        values[13] = GetRegRawInt(playout->I14) ? true : false;
        values[14] = GetRegRawInt(playout->I15) ? true : false;
        values[15] = GetRegRawInt(playout->I16) ? true : false;

        AsmJsSIMDValue result = SIMDBool8x16Operation::OpBool8x16(values);
        SetRegRawSimd(playout->B16_0, result);
    }

    Var InterpreterStackFrame::GetNonVarReg(RegSlot localRegisterID) const
    {
        return m_localSlots[localRegisterID];
    }

    void InterpreterStackFrame::SetNonVarReg(RegSlot localRegisterID, Var aValue)
    {
        m_localSlots[localRegisterID] = aValue;
    }

    Var InterpreterStackFrame::GetRootObject() const
    {
        Assert(!this->GetFunctionBody()->IsJsBuiltInCode());
        Var rootObject = GetReg(Js::FunctionBody::RootObjectRegSlot);
        Assert(rootObject == this->GetFunctionBody()->LoadRootObject());
        return rootObject;
    }

    Var InterpreterStackFrame::OP_ArgIn0()
    {
        return m_inParams[0];
    }

#if ENABLE_PROFILE_INFO
    template <class T>
    void InterpreterStackFrame::OP_ProfiledArgOut_A(const unaligned T * playout)
    {
        FunctionBody* functionBody = this->m_functionBody;
        DynamicProfileInfo * dynamicProfileInfo = functionBody->GetDynamicProfileInfo();

        Assert(playout->Reg > FunctionBody::FirstRegSlot);
        Var value = GetReg(playout->Reg);
        dynamicProfileInfo->RecordParameterAtCallSite(functionBody, playout->profileId, value, playout->Arg, playout->Reg);
        SetOut(playout->Arg, value);
    }
#endif

    template <class T>
    void InterpreterStackFrame::OP_ArgOut_A(const unaligned T * playout)
    {
        SetOut(playout->Arg, GetReg(playout->Reg));
    }
#if DBG
    template <class T>
    void InterpreterStackFrame::OP_ArgOut_ANonVar(const unaligned T * playout)
    {
        SetOut(playout->Arg, GetNonVarReg(playout->Reg));
    }
#endif

    template <class T>
    void InterpreterStackFrame::OP_ArgOut_Env(const unaligned T * playout)
    {
        Var argEnv;
        if (this->m_functionBody->GetLocalFrameDisplayRegister() != Constants::NoRegister)
        {
            argEnv = this->GetLocalFrameDisplay();
        }
        else
        {
            argEnv = this->LdEnv();
        }
        SetOut(playout->Arg, argEnv);
    }

    BOOL InterpreterStackFrame::OP_BrFalse_A(Var aValue, ScriptContext* scriptContext)
    {
        return !JavascriptConversion::ToBoolean(aValue, scriptContext);
    }

    BOOL InterpreterStackFrame::OP_BrTrue_A(Var aValue, ScriptContext* scriptContext)
    {
        return JavascriptConversion::ToBoolean(aValue, scriptContext);
    }

    BOOL InterpreterStackFrame::OP_BrNotNull_A(Var aValue)
    {
        return aValue != NULL;
    }

    bool InterpreterStackFrame::OP_BrOnNotNullObj_A(Var aValue)
    {
        return aValue != scriptContext->GetLibrary()->GetNull();
    }

    BOOL InterpreterStackFrame::OP_BrUndecl_A(Var aValue)
    {
        return this->scriptContext->GetLibrary()->IsUndeclBlockVar(aValue);
    }

    BOOL InterpreterStackFrame::OP_BrNotUndecl_A(Var aValue)
    {
        return !this->scriptContext->GetLibrary()->IsUndeclBlockVar(aValue);
    }

    BOOL InterpreterStackFrame::OP_BrOnHasProperty(Var argInstance, uint propertyIdIndex, ScriptContext* scriptContext)
    {
        return JavascriptOperators::OP_HasProperty(argInstance,
            this->m_functionBody->GetReferencedPropertyId(propertyIdIndex), scriptContext);
    }

    BOOL InterpreterStackFrame::OP_BrOnNoProperty(Var argInstance, uint propertyIdIndex, ScriptContext* scriptContext)
    {
        return !JavascriptOperators::OP_HasProperty(argInstance,
            this->m_functionBody->GetReferencedPropertyId(propertyIdIndex), scriptContext);
    }

    BOOL InterpreterStackFrame::OP_BrOnHasEnvProperty(Var envInstance, int32 slotIndex, uint propertyIdIndex, ScriptContext* scriptContext)
    {
        Var instance = OP_LdFrameDisplaySlot(envInstance, slotIndex);
        return JavascriptOperators::OP_HasProperty(instance,
            this->m_functionBody->GetReferencedPropertyId(propertyIdIndex), scriptContext);
    }

    BOOL InterpreterStackFrame::OP_BrOnClassConstructor(Var aValue)
    {
        return JavascriptOperators::IsClassConstructor(aValue);
    }

    BOOL InterpreterStackFrame::OP_BrOnBaseConstructorKind(Var aValue)
    {
        return JavascriptOperators::IsBaseConstructorKind(aValue);
    }

    bool InterpreterStackFrame::OP_BrOnConstructor(Var aValue)
    {
        return JavascriptOperators::IsConstructor(aValue);
    }

    Var InterpreterStackFrame::OP_LdBaseFncProto()
    {
        return scriptContext->GetLibrary()->GetFunctionPrototype();
    }

    template<class T>
    void InterpreterStackFrame::OP_LdLen(const unaligned T * const playout)
    {
        Assert(playout);

        ThreadContext* threadContext = this->GetScriptContext()->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        Var instance = GetReg(playout->Instance);
        Var length = JavascriptOperators::OP_GetLength(instance, GetScriptContext());

        threadContext->CheckAndResetImplicitCallAccessorFlag();
        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);

        SetReg(playout->Value, length);
    }

#if ENABLE_PROFILE_INFO
    template<class T>
    void InterpreterStackFrame::OP_ProfiledLdLen(const unaligned OpLayoutDynamicProfile<T> *const playout)
    {
        Assert(playout);
        FunctionBody * functionBody = m_functionBody;
        DynamicProfileInfo * profileData = functionBody->GetDynamicProfileInfo();

        Var instance = GetReg(playout->Instance);

        LdLenInfo ldLenInfo;
        ldLenInfo.arrayType = ValueType::Uninitialized.Merge(instance);

        if (this->TestFlags(InterpreterStackFrameFlags_ProcessingBailOutOnArraySpecialization))
        {
            ldLenInfo.disableAggressiveSpecialization = true;
            this->ClearFlags(InterpreterStackFrameFlags_ProcessingBailOutOnArraySpecialization);
        }

        profileData->RecordLengthLoad(functionBody, playout->profileId, ldLenInfo);

        ThreadContext* threadContext = this->GetScriptContext()->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        Var value = ProfilingHelpers::ProfiledLdFld<false, false, false>(
            instance,
            propertyId,
            GetInlineCache(playout->inlineCacheIndex),
            playout->inlineCacheIndex,
            GetFunctionBody(),
            instance);

        SetReg(playout->Value, value);

        threadContext->CheckAndResetImplicitCallAccessorFlag();
        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
    }
#endif

#if ENABLE_PROFILE_INFO

    template <bool doProfile>
    Var InterpreterStackFrame::ProfiledIsIn(Var argProperty, Var instance, ScriptContext* scriptContext, ProfileId profileId)
    {
        if (doProfile)
        {
            DynamicProfileInfo * profileData = m_functionBody->GetDynamicProfileInfo();

            LdElemInfo ldElemInfo;
            ldElemInfo.arrayType = ValueType::Uninitialized.Merge(instance);

            if (this->TestFlags(InterpreterStackFrameFlags_ProcessingBailOutOnArraySpecialization))
            {
                ldElemInfo.disableAggressiveSpecialization = true;
            }
            this->ClearFlags(InterpreterStackFrameFlags_ProcessingBailOutOnArraySpecialization);

            profileData->RecordElementLoad(m_functionBody, profileId, ldElemInfo);
        }

        return JavascriptOperators::IsIn(argProperty, instance, scriptContext);
    }

#else

    template <bool doProfile>
    Var InterpreterStackFrame::ProfiledIsIn(Var argProperty, Var instance, ScriptContext* scriptContext, ProfileId profileId)
    {
        Assert(!doProfile);
        return JavascriptOperators::IsIn(argProperty, instance, scriptContext);
    }

#endif

    JavascriptFunction* InterpreterStackFrame::GetFunctionExpression()
    {
        // Make sure we get the boxed function object if is there, (or the function itself)
        return StackScriptFunction::GetCurrentFunctionObject(this->function->GetRealFunctionObject());
    }

    template <class T>
    void InterpreterStackFrame::OP_LdFunctionExpression(const unaligned T * playout)
    {
        SetRegAllowStackVar(playout->R0, this->GetFunctionExpression());
    }

    template <class T>
    void InterpreterStackFrame::OP_StFunctionExpression(const unaligned T * playout)
    {
        OP_StFunctionExpression(GetReg(playout->Instance), GetReg(playout->Value), playout->PropertyIdIndex);
    }

    template <class T>
    void InterpreterStackFrame::OP_StLocalFunctionExpression(const unaligned T * playout)
    {
        OP_StFunctionExpression(this->localClosure, GetReg(playout->Instance), playout->PropertyIdIndex);
    }

    void InterpreterStackFrame::OP_StFunctionExpression(Var instance, Var value, PropertyIdIndexType index)
    {
        JavascriptOperators::OP_StFunctionExpression(instance,
            this->m_functionBody->GetReferencedPropertyId(index), value);
    }

    template <class T>
    void InterpreterStackFrame::OP_LdNewTarget(const unaligned T* playout)
    {
        if (Js::CallInfo::HasNewTarget(this->m_callFlags))
        {
            SetRegAllowStackVar(playout->R0, (Js::RecyclableObject*)Js::CallInfo::GetNewTarget(this->m_callFlags, this->m_inParams, (ArgSlot)this->m_inSlotsCount));
        }
        else if (this->m_callFlags & CallFlags_New)
        {
            SetRegAllowStackVar(playout->R0, this->GetFunctionExpression());
        }
        else
        {
            SetReg(playout->R0, this->GetScriptContext()->GetLibrary()->GetUndefined());
        }
    }

    template <class T> 
    void InterpreterStackFrame::OP_LdImportMeta(const unaligned T* playout)
    {
        SetReg(playout->R0, JavascriptOperators::OP_LdImportMeta(playout->C1, scriptContext));
    }

    Var InterpreterStackFrame::OP_Ld_A(Var aValue)
    {
        return aValue;
    }

    Var InterpreterStackFrame::LdEnv() const
    {
        return this->function->GetEnvironment();
    }

    void InterpreterStackFrame::SetEnv(FrameDisplay *frameDisplay)
    {
        this->function->SetEnvironment(frameDisplay);
    }

    Var InterpreterStackFrame::OP_LdLocalObj()
    {
        if (!VirtualTableInfo<ActivationObject>::HasVirtualTable(this->localClosure) &&
            !VirtualTableInfo<ActivationObjectEx>::HasVirtualTable(this->localClosure))
        {
            Js::Throw::FatalInternalError();
        }
        return this->localClosure;
    }

    Var InterpreterStackFrame::OP_LdParamObj()
    {
        if (!VirtualTableInfo<ActivationObject>::HasVirtualTable(this->paramClosure) &&
            !VirtualTableInfo<ActivationObjectEx>::HasVirtualTable(this->paramClosure))
        {
            Js::Throw::FatalInternalError();
        }
        return this->paramClosure;
    }

#ifdef ASMJS_PLAT
    template <typename ArrayType, typename RegType>
    void InterpreterStackFrame::OP_StArr(uint32 index, RegSlot regSlot)
    {
        JavascriptArrayBuffer* arr = GetAsmJsBuffer();
        if (index < arr->GetByteLength())
        {
            BYTE* buffer = arr->GetBuffer();
            *(ArrayType*)(buffer + index) = (ArrayType)GetRegRaw<RegType>(regSlot);
        }
    }
#endif

    template<> inline double InterpreterStackFrame::GetArrayViewOverflowVal()
    {
        return *(double*)&NumberConstants::k_Nan;
    }

    template<> inline float InterpreterStackFrame::GetArrayViewOverflowVal()
    {
        return (float)*(double*)&NumberConstants::k_Nan;
    }

    template<typename T> T InterpreterStackFrame::GetArrayViewOverflowVal()
    {
        return 0;
    }

    template <class T>
    void InterpreterStackFrame::OP_LdArrFunc(const unaligned T* playout)
    {
        Var* arr = (Var*)GetRegRawPtr(playout->Instance);
        const uint32 index = (uint32)GetRegRawInt(playout->SlotIndex);
        SetRegRawPtr(playout->Value, arr[index]);
    }

    template <class T>
    void InterpreterStackFrame::OP_LdArrWasmFunc(const unaligned T* playout)
    {
#ifdef ENABLE_WASM
        WebAssemblyTable * table = VarTo<WebAssemblyTable>(GetRegRawPtr(playout->Instance));
        const uint32 index = (uint32)GetRegRawInt(playout->SlotIndex);
        if (index >= table->GetCurrentLength())
        {
            JavascriptError::ThrowWebAssemblyRuntimeError(GetScriptContext(), WASMERR_TableIndexOutOfRange);
        }
        Var func = table->DirectGetValue(index);
        if (!func)
        {
            JavascriptError::ThrowWebAssemblyRuntimeError(GetScriptContext(), WASMERR_NeedWebAssemblyFunc);
        }
        SetRegRawPtr(playout->Value, func);
#endif
    }

    template <class T>
    void InterpreterStackFrame::OP_CheckSignature(const unaligned T* playout)
    {
#ifdef ENABLE_WASM
        ScriptFunction * func = VarTo<ScriptFunction>(GetRegRawPtr(playout->R0));
        int sigIndex = playout->C1;
        Wasm::WasmSignature * expected = &m_signatures[sigIndex];
        if (func->GetFunctionInfo()->IsDeferredParseFunction())
        {
            // TODO: should be able to assert this once imports are converted to wasm functions
            JavascriptError::ThrowWebAssemblyRuntimeError(GetScriptContext(), WASMERR_NeedWebAssemblyFunc);
        }
        AsmJsFunctionInfo * asmInfo = func->GetFunctionBody()->GetAsmJsFunctionInfo();
        if (!asmInfo)
        {
            // TODO: should be able to assert this once imports are converted to wasm functions
            JavascriptError::ThrowWebAssemblyRuntimeError(GetScriptContext(), WASMERR_NeedWebAssemblyFunc);
        }
        if (!expected->IsEquivalent(asmInfo->GetWasmSignature()))
        {
            JavascriptError::ThrowWebAssemblyRuntimeError(GetScriptContext(), WASMERR_SignatureMismatch);
        }
#endif
    }

#ifdef ASMJS_PLAT
    template <typename ArrayType, typename RegType>
    void InterpreterStackFrame::OP_LdArr(uint32 index, RegSlot regSlot)
    {
        JavascriptArrayBuffer* arr = GetAsmJsBuffer();
        BYTE* buffer = arr->GetBuffer();
        ArrayType val = index < (arr->GetByteLength()) ? *(ArrayType*)(buffer + index) : GetArrayViewOverflowVal<ArrayType>();
        SetRegRaw<RegType>(regSlot, (RegType)val);
    }
#endif

    template <class T, typename T2>
    void InterpreterStackFrame::OP_StSlotPrimitive(const unaligned T* playout)
    {
        T2* buffer = (T2*)GetNonVarReg(playout->Instance);
        buffer[playout->SlotIndex] = GetRegRaw<T2>(playout->Value);
    }

    template <class T>
    void InterpreterStackFrame::OP_LdAsmJsSlot(const unaligned T* playout)
    {
        Var * slotArray = (Var*)GetNonVarReg(playout->Instance);
        SetRegRawPtr(playout->Value, slotArray[playout->SlotIndex]);
    }

    template <class T, typename T2>
    void InterpreterStackFrame::OP_LdSlotPrimitive(const unaligned T* playout)
    {
        T2* buffer = (T2*)GetNonVarReg(playout->Instance);
        SetRegRaw<T2>(playout->Value, buffer[playout->SlotIndex]);
    }

#ifndef TEMP_DISABLE_ASMJS
    template <class T>
    void InterpreterStackFrame::OP_LdArrGeneric(const unaligned T* playout)
    {
        const uint32 index = (uint32)GetRegRawInt(playout->SlotIndex);
        switch (playout->ViewType)
        {
#define ARRAYBUFFER_VIEW(name, align, RegType, MemType, ...) \
        case ArrayBufferView::ViewType::TYPE_##name: \
            OP_LdArr<MemType, RegType>(index & ARRAYBUFFER_VIEW_MASK(align), playout->Value); \
            return;
#include "AsmJsArrayBufferViews.h"
        default:Assert(UNREACHED);
        }
    }

    template<typename MemType>
    void InterpreterStackFrame::WasmArrayBoundsCheck(uint64 index, uint32 byteLength)
    {
        if (index + sizeof(MemType) > byteLength)
        {
            JavascriptError::ThrowWebAssemblyRuntimeError(scriptContext, WASMERR_ArrayIndexOutOfRange);
        }
    }

    template<typename MemType>
    MemType* InterpreterStackFrame::WasmAtomicsArrayBoundsCheck(byte* buffer, uint64 index, uint32 byteLength)
    {
        MemType* readBuffer = (MemType*)(buffer + index);
        // Do alignment check to be coherent with the order the jit does the checks
        if (!::Math::IsAligned<intptr_t>((intptr_t)readBuffer, sizeof(MemType)))
        {
            JavascriptError::ThrowWebAssemblyRuntimeError(scriptContext, WASMERR_UnalignedAtomicAccess);
        }
        WasmArrayBoundsCheck<MemType>(index, byteLength);
        return readBuffer;
    }

    template <class T>
    void InterpreterStackFrame::OP_LdArrWasm(const unaligned T* playout)
    {
#ifdef ENABLE_WASM
        Assert(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT);
        const uint64 index = playout->Offset + (uint64)(uint32)GetRegRawInt(playout->SlotIndex);
        ArrayBufferBase* arr = GetWebAssemblyMemory()->GetBuffer();

        uint32 byteLength = arr->GetByteLength();
        BYTE* buffer = arr->GetBuffer();
        switch (playout->ViewType)
        {
#define ARRAYBUFFER_VIEW(name, align, RegType, MemType, ...) \
        case ArrayBufferView::ViewType::TYPE_##name: \
            WasmArrayBoundsCheck<MemType>(index, byteLength); \
            SetRegRaw<RegType>(playout->Value, (RegType)*(MemType*)(buffer + index)); \
            return;
#include "AsmJsArrayBufferViews.h"
        default:Assert(UNREACHED);
        }
#else
        Assert(UNREACHED);
#endif
    }

    template <class T>
    void InterpreterStackFrame::OP_LdArrAtomic(const unaligned T* playout)
    {
#ifdef ENABLE_WASM
        Assert(Wasm::Threads::IsEnabled());
        Assert(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT);
        const uint64 index = playout->Offset + (uint64)(uint32)GetRegRawInt(playout->SlotIndex);
        ArrayBufferBase* arr = GetWebAssemblyMemory()->GetBuffer();

        uint32 byteLength = arr->GetByteLength();
        BYTE* buffer = arr->GetBuffer();
        switch (playout->ViewType)
        {
#define ARRAYBUFFER_VIEW_INT(name, align, RegType, MemType, ...) \
        case ArrayBufferView::ViewType::TYPE_##name: {\
            MemType* readBuffer = WasmAtomicsArrayBoundsCheck<MemType>(buffer, index, byteLength); \
            MemType value = AtomicsOperations::Load<MemType>(readBuffer); \
            SetRegRaw<RegType>(playout->Value, (RegType)value); \
            return; \
        }
#include "AsmJsArrayBufferViews.h"
        default:Assert(UNREACHED);
        }
#else
        Assert(UNREACHED);
#endif
    }

    template <class T>
    void InterpreterStackFrame::OP_StArrAtomic(const unaligned T* playout)
    {
#ifdef ENABLE_WASM
        Assert(Wasm::Threads::IsEnabled());
        Assert(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT);
        const uint64 index = playout->Offset + (uint64)(uint32)GetRegRawInt(playout->SlotIndex);
        ArrayBufferBase* arr = GetWebAssemblyMemory()->GetBuffer();

        uint32 byteLength = arr->GetByteLength();
        BYTE* buffer = arr->GetBuffer();
        switch (playout->ViewType)
        {
#define ARRAYBUFFER_VIEW_INT(name, align, RegType, MemType, ...) \
        case ArrayBufferView::ViewType::TYPE_##name: {\
            MemType* readBuffer = WasmAtomicsArrayBoundsCheck<MemType>(buffer, index, byteLength); \
            MemType value = (MemType)GetRegRaw<RegType>(playout->Value); \
            MemType storedValue = AtomicsOperations::Store<MemType>(readBuffer, value); \
            Assert(storedValue == value); \
            return; \
        }
#include "AsmJsArrayBufferViews.h"
        default:Assert(UNREACHED);
        }
#else
        Assert(UNREACHED);
#endif
    }

    template <class T>
    void InterpreterStackFrame::OP_LdArrConstIndex(const unaligned T* playout)
    {
        switch (playout->ViewType)
        {
#define ARRAYBUFFER_VIEW(name, align, RegType, MemType, ...) \
        case ArrayBufferView::ViewType::TYPE_##name: \
            OP_LdArr<MemType, RegType>(playout->SlotIndex, playout->Value); \
            return;
#include "AsmJsArrayBufferViews.h"
        default:Assert(UNREACHED);
        }
    }
    template <class T>
    void InterpreterStackFrame::OP_StArrGeneric(const unaligned T* playout)
    {
        const uint32 index = (uint32)GetRegRawInt(playout->SlotIndex);
        switch (playout->ViewType)
        {
#define ARRAYBUFFER_VIEW(name, align, RegType, MemType, ...) \
        case ArrayBufferView::ViewType::TYPE_##name: \
            OP_StArr<MemType, RegType>(index & ARRAYBUFFER_VIEW_MASK(align), playout->Value); \
            return;
#include "AsmJsArrayBufferViews.h"
        default:Assert(UNREACHED);
        }
    }
    template <class T>
    void InterpreterStackFrame::OP_StArrWasm(const unaligned T* playout)
    {
#ifdef ENABLE_WASM
        Assert(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT);
        const uint64 index = playout->Offset + (uint64)(uint32)GetRegRawInt(playout->SlotIndex);
        ArrayBufferBase* arr = GetWebAssemblyMemory()->GetBuffer();

        uint32 byteLength = arr->GetByteLength();
        BYTE* buffer = arr->GetBuffer();
        switch (playout->ViewType)
        {
#define ARRAYBUFFER_VIEW(name, align, RegType, MemType, ...) \
        case ArrayBufferView::ViewType::TYPE_##name: \
            WasmArrayBoundsCheck<MemType>(index, byteLength); \
            *(MemType*)(buffer + index) = (MemType)(GetRegRaw<RegType>(playout->Value)); \
            break;
#include "AsmJsArrayBufferViews.h"
        default:Assert(UNREACHED);
        }
        CompileAssert(ArrayBufferView::ViewType::TYPE_COUNT == 15);
#if DBG
        if (PHASE_TRACE(WasmMemWritesPhase, m_functionBody))
        {
            GetWebAssemblyMemory()->TraceMemWrite(GetWebAssemblyMemory(), (uint32)GetRegRawInt(playout->SlotIndex), playout->Offset, playout->ViewType, (uint32)(size_t)this->DEBUG_currentByteOffset, scriptContext);
        }
#endif
        return;
#else
        Assert(UNREACHED);
#endif
    }
    template <class T>
    void InterpreterStackFrame::OP_StArrConstIndex(const unaligned T* playout)
    {
        switch (playout->ViewType)
        {
#define ARRAYBUFFER_VIEW(name, align, RegType, MemType, ...) \
        case ArrayBufferView::ViewType::TYPE_##name: \
            OP_StArr<MemType, RegType>(playout->SlotIndex, playout->Value); \
            return;
#include "AsmJsArrayBufferViews.h"
        default:Assert(UNREACHED);
        }
    }
#endif

    Var InterpreterStackFrame::OP_LdSlot(Var instance, int32 slotIndex)
    {
        if (!PHASE_OFF(ClosureRangeCheckPhase, this->m_functionBody))
        {
            if ((uintptr_t)((Var*)instance)[ScopeSlots::EncodedSlotCountSlotIndex] <= (uintptr_t)(slotIndex - ScopeSlots::FirstSlotIndex))
            {
                Js::Throw::FatalInternalError();
            }
        }
        return ((Var*)(instance))[slotIndex];
    }

    template <class T>
    Var InterpreterStackFrame::OP_LdSlot(Var instance, const unaligned T* playout)
    {
        return OP_LdSlot(instance, playout->SlotIndex);
    }

#if ENABLE_PROFILE_INFO
    template <class T>
    Var InterpreterStackFrame::OP_ProfiledLdSlot(Var instance, const unaligned T* playout)
    {
        Var value = OP_LdSlot(instance, playout->SlotIndex);
        ProfilingHelpers::ProfileLdSlot(value, GetFunctionBody(), playout->profileId);
        return value;
    }
#endif

    template <class T>
    Var InterpreterStackFrame::OP_LdInnerSlot(Var slotArray, const unaligned T* playout)
    {
        return OP_LdSlot(slotArray, playout->SlotIndex2);
    }

#if ENABLE_PROFILE_INFO
    template <class T>
    Var InterpreterStackFrame::OP_ProfiledLdInnerSlot(Var slotArray, const unaligned T* playout)
    {
        Var value = OP_LdInnerSlot(slotArray, playout);
        ProfilingHelpers::ProfileLdSlot(value, GetFunctionBody(), playout->profileId);
        return value;
    }
#endif

    template <class T>
    Var InterpreterStackFrame::OP_LdInnerObjSlot(Var slotArray, const unaligned T* playout)
    {
        return OP_LdObjSlot(slotArray, playout->SlotIndex2);
    }

#if ENABLE_PROFILE_INFO
    template <class T>
    Var InterpreterStackFrame::OP_ProfiledLdInnerObjSlot(Var slotArray, const unaligned T* playout)
    {
        Var value = OP_LdInnerObjSlot(slotArray, playout);
        ProfilingHelpers::ProfileLdSlot(value, GetFunctionBody(), playout->profileId);
        return value;
    }
#endif

    Var InterpreterStackFrame::OP_LdFrameDisplaySlot(Var instance, int32 slotIndex)
    {
        if (!PHASE_OFF(ClosureRangeCheckPhase, this->m_functionBody))
        {
            if (((FrameDisplay*)instance)->GetLength() <= slotIndex - Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Var))
            {
                Js::Throw::FatalInternalError();
            }
        }
        return ((Var*)instance)[slotIndex];
    }

    template <class T>
    Var InterpreterStackFrame::OP_LdEnvObj(Var instance, const unaligned T* playout)
    {
        return OP_LdFrameDisplaySlot(instance, playout->SlotIndex);
    }

    template <class T>
    Var InterpreterStackFrame::OP_LdEnvSlot(Var instance, const unaligned T* playout)
    {
        Var slotArray = OP_LdFrameDisplaySlot(instance, playout->SlotIndex1);
        return OP_LdSlot(slotArray, playout->SlotIndex2);
    }

#if ENABLE_PROFILE_INFO
    template <class T>
    Var InterpreterStackFrame::OP_ProfiledLdEnvSlot(Var instance, const unaligned T* playout)
    {
        Var value = OP_LdEnvSlot(instance, playout);
        ProfilingHelpers::ProfileLdSlot(value, GetFunctionBody(), playout->profileId);
        return value;
    }
#endif

    Var InterpreterStackFrame::OP_LdObjSlot(Var instance, int32 slotIndex)
    {
        Var *slotArray = *(Var**)((char*)instance + DynamicObject::GetOffsetOfAuxSlots());
        return slotArray[slotIndex];
    }

    template <class T>
    Var InterpreterStackFrame::OP_LdObjSlot(Var instance, const unaligned T* playout)
    {
        return OP_LdObjSlot(instance, playout->SlotIndex);
    }

#if ENABLE_PROFILE_INFO
    template <class T>
    Var InterpreterStackFrame::OP_ProfiledLdObjSlot(Var instance, const unaligned T* playout)
    {
        Var value = OP_LdObjSlot(instance, playout->SlotIndex);
        ProfilingHelpers::ProfileLdSlot(value, GetFunctionBody(), playout->profileId);
        return value;
    }
#endif

    template <class T>
    Var InterpreterStackFrame::OP_LdEnvObjSlot(Var instance, const unaligned T* playout)
    {
        Var slotArray = OP_LdFrameDisplaySlot(instance, playout->SlotIndex1);
        return OP_LdObjSlot(slotArray, playout->SlotIndex2);
    }

    template <class T>
    Var InterpreterStackFrame::OP_LdModuleSlot(Var instance, const unaligned T* playout)
    {
        return JavascriptOperators::OP_LdModuleSlot(playout->SlotIndex1, playout->SlotIndex2, scriptContext);
    }

    inline void InterpreterStackFrame::OP_StModuleSlot(Var instance, uint32 slotIndex1, uint32 slotIndex2, Var value)
    {
        JavascriptOperators::OP_StModuleSlot(slotIndex1, slotIndex2, value, scriptContext);
    }

#if ENABLE_PROFILE_INFO
    template <class T>
    Var InterpreterStackFrame::OP_ProfiledLdEnvObjSlot(Var instance, const unaligned T* playout)
    {
        Var value = OP_LdEnvObjSlot(instance, playout);
        ProfilingHelpers::ProfileLdSlot(value, GetFunctionBody(), playout->profileId);
        return value;
    }
#endif

    void InterpreterStackFrame::OP_StSlot(Var instance, int32 slotIndex, Var value)
    {
        // We emit OpCode::StSlot in the bytecode only for scope slot arrays, which are not recyclable objects.
        if (!PHASE_OFF(ClosureRangeCheckPhase, this->m_functionBody))
        {
            if ((uintptr_t)((Var*)instance)[ScopeSlots::EncodedSlotCountSlotIndex] <= (uintptr_t)(slotIndex - ScopeSlots::FirstSlotIndex))
            {
                Js::Throw::FatalInternalError();
            }
        }
        ((Field(Var)*)(instance))[slotIndex] = value;
    }

    void InterpreterStackFrame::OP_StEnvSlot(Var instance, int32 slotIndex1, int32 slotIndex2, Var value)
    {
        Var slotArray = (Var*)OP_LdFrameDisplaySlot(instance, slotIndex1);
        OP_StSlot(slotArray, slotIndex2, value);
    }

    void InterpreterStackFrame::OP_StSlotChkUndecl(Var instance, int32 slotIndex, Var value)
    {
        // We emit OpCode::StSlot in the bytecode only for scope slot arrays, which are not recyclable objects.
        if (!PHASE_OFF(ClosureRangeCheckPhase, this->m_functionBody))
        {
            if ((uintptr_t)((Var*)instance)[ScopeSlots::EncodedSlotCountSlotIndex] <= (uintptr_t)(slotIndex - ScopeSlots::FirstSlotIndex))
            {
                Js::Throw::FatalInternalError();
            }
        }
        OP_ChkUndecl(((Field(Var)*)instance)[slotIndex]);
        ((Field(Var)*)(instance))[slotIndex] = value;
    }

    void InterpreterStackFrame::OP_StEnvSlotChkUndecl(Var instance, int32 slotIndex1, int32 slotIndex2, Var value)
    {
        Var slotArray = OP_LdFrameDisplaySlot(instance, slotIndex1);
        OP_StSlotChkUndecl(slotArray, slotIndex2, value);
    }

    void InterpreterStackFrame::OP_StObjSlot(Var instance, int32 slotIndex, Var value)
    {
        // It would be nice to assert that it's ok to store directly to slot, but we don't have the propertyId.
        Field(Var) *slotArray = *(Field(Var)**)((char*)instance + DynamicObject::GetOffsetOfAuxSlots());
        slotArray[slotIndex] = value;
    }

    void InterpreterStackFrame::OP_StObjSlotChkUndecl(Var instance, int32 slotIndex, Var value)
    {
        // It would be nice to assert that it's ok to store directly to slot, but we don't have the propertyId.
        Field(Var) *slotArray = *(Field(Var)**)((char*)instance + DynamicObject::GetOffsetOfAuxSlots());
        OP_ChkUndecl(slotArray[slotIndex]);
        slotArray[slotIndex] = value;
    }

    void InterpreterStackFrame::OP_StEnvObjSlot(Var instance, int32 slotIndex1, int32 slotIndex2, Var value)
    {
        // It would be nice to assert that it's ok to store directly to slot, but we don't have the propertyId.
        Var envInstance = (Var*)OP_LdFrameDisplaySlot(instance, slotIndex1);
        OP_StObjSlot(envInstance, slotIndex2, value);
    }

    void InterpreterStackFrame::OP_StEnvObjSlotChkUndecl(Var instance, int32 slotIndex1, int32 slotIndex2, Var value)
    {
        // It would be nice to assert that it's ok to store directly to slot, but we don't have the propertyId.
        Var envInstance = (Var*)OP_LdFrameDisplaySlot(instance, slotIndex1);
        OP_StObjSlotChkUndecl(envInstance, slotIndex2, value);
    }

    Var InterpreterStackFrame::OP_LdStackArgPtr(void)
    {
        // Return the address of the first param after "this".
        return m_inParams + 1;
    }

    ForInObjectEnumerator * InterpreterStackFrame::GetForInEnumerator(uint forInLoopLevel)
    {
        Assert(forInLoopLevel < this->m_functionBody->GetForInLoopDepth());
        return &this->forInObjectEnumerators[forInLoopLevel];
    }

    void InterpreterStackFrame::OP_InitForInEnumerator(Var object, uint forInLoopLevel)
    {
        JavascriptOperators::OP_InitForInEnumerator(object, GetForInEnumerator(forInLoopLevel), this->GetScriptContext());
    }

    void InterpreterStackFrame::OP_InitForInEnumeratorWithCache(Var object, uint forInLoopLevel, ProfileId profileId)
    {
        JavascriptOperators::OP_InitForInEnumerator(object, GetForInEnumerator(forInLoopLevel), this->GetScriptContext(),
            m_functionBody->GetForInCache(profileId));
    }

    // Called for the debug purpose, to create the arguments object explicitly even though script has not declared it.
    Var InterpreterStackFrame::CreateHeapArguments(ScriptContext* scriptContext)
    {
        return JavascriptOperators::LoadHeapArguments(this->function->GetRealFunctionObject(), this->m_inSlotsCount - 1, &this->m_inParams[1], scriptContext->GetLibrary()->GetNull(), scriptContext->GetLibrary()->GetNull(), scriptContext, false);
    }

    template <bool letArgs>
    Var InterpreterStackFrame::LdHeapArgumentsImpl(Var argsArray, ScriptContext* scriptContext)
    {
        Var frameObj;
        if (m_functionBody->HasScopeObject() && argsArray != scriptContext->GetLibrary()->GetNull())
        {
            frameObj = this->localClosure;
            Assert(frameObj);
        }
        else
        {
            frameObj = scriptContext->GetLibrary()->GetNull();
        }
        Var args = JavascriptOperators::LoadHeapArguments(this->function->GetRealFunctionObject(), this->m_inSlotsCount - 1, &this->m_inParams[1], frameObj, argsArray, scriptContext, letArgs);
        this->m_arguments = args;
        return args;
    }

    Var InterpreterStackFrame::OP_LdHeapArguments(ScriptContext* scriptContext)
    {
        Var argsArray = m_functionBody->GetFormalsPropIdArrayOrNullObj();
        return LdHeapArgumentsImpl<false>(argsArray, scriptContext);
    }

    Var InterpreterStackFrame::OP_LdLetHeapArguments(ScriptContext* scriptContext)
    {
        Var argsArray = m_functionBody->GetFormalsPropIdArrayOrNullObj();
        return LdHeapArgumentsImpl<true>(argsArray, scriptContext);
    }

    Var InterpreterStackFrame::OP_LdHeapArgsCached(ScriptContext* scriptContext)
    {
        uint32 formalsCount = this->m_functionBody->GetInParamsCount() - 1;
        Var args = JavascriptOperators::LoadHeapArgsCached(this->function->GetRealFunctionObject(), this->m_inSlotsCount - 1, formalsCount, &this->m_inParams[1], this->localClosure, scriptContext, false);
        this->m_arguments = args;
        return args;
    }

    Var InterpreterStackFrame::OP_LdLetHeapArgsCached(ScriptContext* scriptContext)
    {
        uint32 formalsCount = this->m_functionBody->GetInParamsCount() - 1;
        Var args = JavascriptOperators::LoadHeapArgsCached(this->function->GetRealFunctionObject(), this->m_inSlotsCount - 1, formalsCount, &this->m_inParams[1], this->localClosure, scriptContext, true);
        this->m_arguments = args;
        return args;
    }

    HeapArgumentsObject * InterpreterStackFrame::CreateEmptyHeapArgumentsObject(ScriptContext* scriptContext)
    {
        HeapArgumentsObject * args = JavascriptOperators::CreateHeapArguments(this->function->GetRealFunctionObject(), this->m_inSlotsCount - 1, 0, nullptr, scriptContext);
        this->m_arguments = args;
        return args;
    }

    void InterpreterStackFrame::TrySetFrameObjectInHeapArgObj(ScriptContext * scriptContext, bool hasNonSimpleParams, bool isScopeObjRestored)
    {
        Var frameObject = nullptr;

        uint32 formalsCount = this->m_functionBody->GetInParamsCount() - 1;
        Js::PropertyIdArray * propIds = nullptr;
        Js::HeapArgumentsObject* heapArgObj = nullptr;

        //We always set the Frame object to nullptr in BailOutRecord::EnsureArguments for stack args optimization.
        if (m_arguments != nullptr && ((Js::HeapArgumentsObject*)(m_arguments))->GetFrameObject() == nullptr)
        {
            heapArgObj = (Js::HeapArgumentsObject*)m_arguments;
        }

        bool isCachedScope = false;

        //For Non-simple params, we don't have a scope object created.
        if (this->m_functionBody->NeedScopeObjectForArguments(hasNonSimpleParams))
        {
            frameObject = GetLocalClosure();

            isCachedScope = m_functionBody->HasCachedScopePropIds();
            propIds = this->m_functionBody->GetFormalsPropIdArray();

            if (isScopeObjRestored && VarIs<ActivationObject>(frameObject))
            {
                Assert(this->GetFunctionBody()->GetDoScopeObjectCreation());
                isCachedScope = true;
                if (PHASE_VERBOSE_TRACE1(Js::StackArgFormalsOptPhase) && m_functionBody->GetInParamsCount() > 1)
                {
                    Output::Print(_u("StackArgFormals : %s (%d) :Using the restored scope object in the bail out path. \n"), m_functionBody->GetDisplayName(), m_functionBody->GetFunctionNumber());
                    Output::Flush();
                }
            }
            else
            {
                if (isCachedScope)
                {
                    Field(DynamicType*) literalType = nullptr;
                    Assert(!propIds->hasNonSimpleParams && !hasNonSimpleParams);
                    frameObject = JavascriptOperators::OP_InitCachedScope(this->GetJavascriptFunction(), propIds, &literalType, hasNonSimpleParams, scriptContext);
                }
                else
                {
                    frameObject = JavascriptOperators::OP_NewScopeObject(GetScriptContext());
                }
                Assert(propIds != nullptr);
                SetLocalClosure(frameObject);

                if (PHASE_VERBOSE_TRACE1(Js::StackArgFormalsOptPhase) && m_functionBody->GetInParamsCount() > 1)
                {
                    Output::Print(_u("StackArgFormals : %s (%d) :Creating scope object in the bail out path. \n"), m_functionBody->GetDisplayName(), m_functionBody->GetFunctionNumber());
                    Output::Flush();
                }
            }
        }
        else
        {
            //We reached here because, either we don't have any formals or we don't have a scope object (it could be in strict mode or have non-simple param list)
            Assert(formalsCount == 0 || (m_functionBody->GetIsStrictMode() || hasNonSimpleParams));
            frameObject = nullptr;
            formalsCount = 0;

            if (PHASE_VERBOSE_TRACE1(Js::StackArgOptPhase))
            {
                Output::Print(_u("StackArgOpt : %s (%d) :Creating NULL scope object in the bail out path. \n"), m_functionBody->GetDisplayName(), m_functionBody->GetFunctionNumber());
                Output::Flush();
            }
        }

        if (heapArgObj)
        {
            Assert(frameObject == nullptr || VarIs<ActivationObject>(frameObject));
            heapArgObj->SetFormalCount(formalsCount);
            heapArgObj->SetFrameObject(frameObject != nullptr ?
                static_cast<ActivationObject*>(frameObject) : nullptr);

            if (PHASE_TRACE1(Js::StackArgFormalsOptPhase) && formalsCount > 0)
            {
                Output::Print(_u("StackArgFormals : %s (%d) :Attaching the scope object with the heap arguments object in the bail out path. \n"), m_functionBody->GetDisplayName(), m_functionBody->GetFunctionNumber());
                Output::Flush();
            }
        }

        //Fill the Heap arguments and scope object with values
        // If there is no heap arguments object, then fill only the scope object with actuals.
        JavascriptOperators::FillScopeObject(this->function->GetRealFunctionObject(), this->m_inSlotsCount - 1, formalsCount, frameObject, &this->m_inParams[1], propIds, heapArgObj, scriptContext, hasNonSimpleParams, isCachedScope);
    }

    Var InterpreterStackFrame::OP_LdArgumentsFromFrame()
    {
        return this->m_arguments;
    }

    void* InterpreterStackFrame::OP_LdArgCnt()
    {
        return (void*)m_inSlotsCount;
    }

    void* InterpreterStackFrame::operator new(size_t byteSize, void* previousAllocation) throw()
    {
        //
        // Placement 'new' is used by InterpreterStackFrame to initialize the C++ object on the RcInterpreter's
        // program stack:
        // - Unlike most other allocations, the previously allocated memory will __not__ be
        //   zero-initialized, as we do not want the overhead of zero-initializing the frame when
        //   calling functions.
        //
        // NOTE: If we wanted to add C# semantics of all locals are automatically zero-initialized,
        // need to determine the most efficient mechanism for this.
        //

        return previousAllocation;
    }

    void __cdecl InterpreterStackFrame::operator delete(void * allocationToFree, void * previousAllocation) throw()
    {
        AssertMsg(allocationToFree == previousAllocation, "Memory locations should match");
        AssertMsg(false, "This function should never actually be called");
    }

    void InterpreterStackFrame::OP_WasmPrintFunc(int regIndex)
    {
#if defined(ENABLE_DEBUG_CONFIG_OPTIONS) && defined(ENABLE_WASM)
        Assert(m_functionBody->IsWasmFunction());
        uint index = GetRegRawInt(regIndex);
        Wasm::WasmFunctionInfo* info = m_functionBody->GetAsmJsFunctionInfo()->GetWebAssemblyModule()->GetWasmFunctionInfo(index);
        int col = WAsmJs::Tracing::GetPrintCol();
        if (col > 0)
        {
            Output::SkipToColumn(col);
        }
        info->GetBody()->DumpFullFunctionName();
        Output::Print(_u("("));
#endif
    }

    JavascriptArrayBuffer* InterpreterStackFrame::GetAsmJsBuffer() const
    {
        AssertMsg(!m_functionBody->IsWasmFunction(), "Do not use GetAsmJsBuffer for WebAssembly, Use GetWebAssemblyMemory instead");
        return m_asmJsBuffer;
    }

#ifdef ENABLE_WASM
    WebAssemblyMemory* InterpreterStackFrame::GetWebAssemblyMemory() const
    {
        AssertMsg(m_functionBody->IsWasmFunction(), "Do not use GetWebAssemblyMemory for Asm.js, Use GetAsmJsBuffer instead");
        return m_wasmMemory;
    }
#endif

    template void* Js::InterpreterStackFrame::GetReg<unsigned int>(unsigned int) const;
    template void Js::InterpreterStackFrame::SetReg<unsigned int>(unsigned int, void*);
}